

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  long lVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  bool bVar74;
  uint uVar75;
  uint uVar76;
  ulong uVar77;
  long lVar78;
  uint uVar79;
  ulong uVar80;
  uint uVar82;
  long lVar83;
  bool bVar84;
  float t1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar87 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar132 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar173;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar177;
  float fVar194;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar198;
  float fVar218;
  float fVar219;
  undefined1 auVar199 [16];
  float fVar220;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar217 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar229 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  vfloat4 b0;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar294;
  float fVar295;
  vfloat4 a0_1;
  float fVar296;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar309;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar297;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar307;
  float fVar308;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar310;
  float fVar315;
  undefined1 auVar311 [16];
  float fVar313;
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float in_register_0000151c;
  undefined1 auVar312 [32];
  float fVar322;
  float fVar323;
  float fVar333;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar331;
  float fVar332;
  undefined1 auVar329 [32];
  float fVar334;
  float fVar335;
  undefined1 auVar330 [32];
  float fVar336;
  float fVar346;
  undefined1 auVar338 [16];
  float fVar337;
  float fVar343;
  float fVar345;
  undefined1 auVar339 [16];
  float fVar342;
  float fVar344;
  float in_register_0000159c;
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  vfloat4 a0;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_721;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  uint local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar81;
  undefined1 auVar170 [32];
  undefined1 auVar351 [32];
  
  PVar9 = prim[1];
  uVar77 = (ulong)(byte)PVar9;
  lVar83 = uVar77 * 5;
  fVar198 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar206 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar206 = vinsertps_avx(auVar206,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar111 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar101._0_4_ = fVar198 * auVar111._0_4_;
  auVar101._4_4_ = fVar198 * auVar111._4_4_;
  auVar101._8_4_ = fVar198 * auVar111._8_4_;
  auVar101._12_4_ = fVar198 * auVar111._12_4_;
  auVar199._0_4_ = fVar198 * auVar206._0_4_;
  auVar199._4_4_ = fVar198 * auVar206._4_4_;
  auVar199._8_4_ = fVar198 * auVar206._8_4_;
  auVar199._12_4_ = fVar198 * auVar206._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 10)));
  auVar90._16_16_ = auVar206;
  auVar90._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar83 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar83 + 10)));
  auVar140._16_16_ = auVar206;
  auVar140._0_16_ = auVar111;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 10)));
  auVar14 = vcvtdq2ps_avx(auVar140);
  auVar163._16_16_ = auVar206;
  auVar163._0_16_ = auVar111;
  auVar15 = vcvtdq2ps_avx(auVar163);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 10)));
  auVar188._16_16_ = auVar206;
  auVar188._0_16_ = auVar111;
  uVar80 = (ulong)((uint)(byte)PVar9 * 0xc);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar188);
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar234._16_16_ = auVar206;
  auVar234._0_16_ = auVar111;
  auVar17 = vcvtdq2ps_avx(auVar234);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar77 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar77 + 10)));
  auVar245._16_16_ = auVar206;
  auVar245._0_16_ = auVar111;
  auVar18 = vcvtdq2ps_avx(auVar245);
  lVar78 = uVar77 * 9;
  uVar80 = (ulong)(uint)((int)lVar78 * 2);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar264._16_16_ = auVar206;
  auVar264._0_16_ = auVar111;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar77 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar77 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar264);
  auVar282._16_16_ = auVar206;
  auVar282._0_16_ = auVar111;
  auVar20 = vcvtdq2ps_avx(auVar282);
  uVar80 = (ulong)(uint)((int)lVar83 << 2);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 10)));
  auVar291._16_16_ = auVar206;
  auVar291._0_16_ = auVar111;
  auVar21 = vcvtdq2ps_avx(auVar291);
  auVar111 = vshufps_avx(auVar199,auVar199,0);
  auVar206 = vshufps_avx(auVar199,auVar199,0x55);
  auVar215 = vshufps_avx(auVar199,auVar199,0xaa);
  fVar198 = auVar215._0_4_;
  fVar218 = auVar215._4_4_;
  fVar219 = auVar215._8_4_;
  fVar220 = auVar215._12_4_;
  fVar221 = auVar206._0_4_;
  fVar222 = auVar206._4_4_;
  fVar223 = auVar206._8_4_;
  fVar147 = auVar206._12_4_;
  fVar171 = auVar111._0_4_;
  fVar172 = auVar111._4_4_;
  fVar173 = auVar111._8_4_;
  fVar174 = auVar111._12_4_;
  auVar312._0_4_ = fVar171 * auVar90._0_4_ + fVar221 * auVar14._0_4_ + fVar198 * auVar15._0_4_;
  auVar312._4_4_ = fVar172 * auVar90._4_4_ + fVar222 * auVar14._4_4_ + fVar218 * auVar15._4_4_;
  auVar312._8_4_ = fVar173 * auVar90._8_4_ + fVar223 * auVar14._8_4_ + fVar219 * auVar15._8_4_;
  auVar312._12_4_ = fVar174 * auVar90._12_4_ + fVar147 * auVar14._12_4_ + fVar220 * auVar15._12_4_;
  auVar312._16_4_ = fVar171 * auVar90._16_4_ + fVar221 * auVar14._16_4_ + fVar198 * auVar15._16_4_;
  auVar312._20_4_ = fVar172 * auVar90._20_4_ + fVar222 * auVar14._20_4_ + fVar218 * auVar15._20_4_;
  auVar312._24_4_ = fVar173 * auVar90._24_4_ + fVar223 * auVar14._24_4_ + fVar219 * auVar15._24_4_;
  auVar312._28_4_ = fVar147 + in_register_000015dc + in_register_0000151c;
  auVar305._0_4_ = fVar171 * auVar16._0_4_ + fVar221 * auVar17._0_4_ + fVar198 * auVar18._0_4_;
  auVar305._4_4_ = fVar172 * auVar16._4_4_ + fVar222 * auVar17._4_4_ + fVar218 * auVar18._4_4_;
  auVar305._8_4_ = fVar173 * auVar16._8_4_ + fVar223 * auVar17._8_4_ + fVar219 * auVar18._8_4_;
  auVar305._12_4_ = fVar174 * auVar16._12_4_ + fVar147 * auVar17._12_4_ + fVar220 * auVar18._12_4_;
  auVar305._16_4_ = fVar171 * auVar16._16_4_ + fVar221 * auVar17._16_4_ + fVar198 * auVar18._16_4_;
  auVar305._20_4_ = fVar172 * auVar16._20_4_ + fVar222 * auVar17._20_4_ + fVar218 * auVar18._20_4_;
  auVar305._24_4_ = fVar173 * auVar16._24_4_ + fVar223 * auVar17._24_4_ + fVar219 * auVar18._24_4_;
  auVar305._28_4_ = fVar147 + in_register_000015dc + in_register_0000159c;
  auVar217._0_4_ = fVar171 * auVar19._0_4_ + fVar221 * auVar20._0_4_ + auVar21._0_4_ * fVar198;
  auVar217._4_4_ = fVar172 * auVar19._4_4_ + fVar222 * auVar20._4_4_ + auVar21._4_4_ * fVar218;
  auVar217._8_4_ = fVar173 * auVar19._8_4_ + fVar223 * auVar20._8_4_ + auVar21._8_4_ * fVar219;
  auVar217._12_4_ = fVar174 * auVar19._12_4_ + fVar147 * auVar20._12_4_ + auVar21._12_4_ * fVar220;
  auVar217._16_4_ = fVar171 * auVar19._16_4_ + fVar221 * auVar20._16_4_ + auVar21._16_4_ * fVar198;
  auVar217._20_4_ = fVar172 * auVar19._20_4_ + fVar222 * auVar20._20_4_ + auVar21._20_4_ * fVar218;
  auVar217._24_4_ = fVar173 * auVar19._24_4_ + fVar223 * auVar20._24_4_ + auVar21._24_4_ * fVar219;
  auVar217._28_4_ = fVar174 + fVar147 + fVar220;
  auVar111 = vshufps_avx(auVar101,auVar101,0);
  auVar206 = vshufps_avx(auVar101,auVar101,0x55);
  auVar215 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar218 = auVar215._0_4_;
  fVar219 = auVar215._4_4_;
  fVar220 = auVar215._8_4_;
  fVar221 = auVar215._12_4_;
  fVar172 = auVar206._0_4_;
  fVar173 = auVar206._4_4_;
  fVar174 = auVar206._8_4_;
  fVar175 = auVar206._12_4_;
  fVar222 = auVar111._0_4_;
  fVar223 = auVar111._4_4_;
  fVar147 = auVar111._8_4_;
  fVar171 = auVar111._12_4_;
  fVar198 = auVar90._28_4_;
  auVar235._0_4_ = fVar222 * auVar90._0_4_ + fVar172 * auVar14._0_4_ + fVar218 * auVar15._0_4_;
  auVar235._4_4_ = fVar223 * auVar90._4_4_ + fVar173 * auVar14._4_4_ + fVar219 * auVar15._4_4_;
  auVar235._8_4_ = fVar147 * auVar90._8_4_ + fVar174 * auVar14._8_4_ + fVar220 * auVar15._8_4_;
  auVar235._12_4_ = fVar171 * auVar90._12_4_ + fVar175 * auVar14._12_4_ + fVar221 * auVar15._12_4_;
  auVar235._16_4_ = fVar222 * auVar90._16_4_ + fVar172 * auVar14._16_4_ + fVar218 * auVar15._16_4_;
  auVar235._20_4_ = fVar223 * auVar90._20_4_ + fVar173 * auVar14._20_4_ + fVar219 * auVar15._20_4_;
  auVar235._24_4_ = fVar147 * auVar90._24_4_ + fVar174 * auVar14._24_4_ + fVar220 * auVar15._24_4_;
  auVar235._28_4_ = fVar198 + auVar14._28_4_ + auVar15._28_4_;
  auVar141._0_4_ = fVar222 * auVar16._0_4_ + fVar172 * auVar17._0_4_ + fVar218 * auVar18._0_4_;
  auVar141._4_4_ = fVar223 * auVar16._4_4_ + fVar173 * auVar17._4_4_ + fVar219 * auVar18._4_4_;
  auVar141._8_4_ = fVar147 * auVar16._8_4_ + fVar174 * auVar17._8_4_ + fVar220 * auVar18._8_4_;
  auVar141._12_4_ = fVar171 * auVar16._12_4_ + fVar175 * auVar17._12_4_ + fVar221 * auVar18._12_4_;
  auVar141._16_4_ = fVar222 * auVar16._16_4_ + fVar172 * auVar17._16_4_ + fVar218 * auVar18._16_4_;
  auVar141._20_4_ = fVar223 * auVar16._20_4_ + fVar173 * auVar17._20_4_ + fVar219 * auVar18._20_4_;
  auVar141._24_4_ = fVar147 * auVar16._24_4_ + fVar174 * auVar17._24_4_ + fVar220 * auVar18._24_4_;
  auVar141._28_4_ = fVar198 + auVar15._28_4_ + auVar18._28_4_;
  auVar121._0_4_ = fVar222 * auVar19._0_4_ + fVar172 * auVar20._0_4_ + auVar21._0_4_ * fVar218;
  auVar121._4_4_ = fVar223 * auVar19._4_4_ + fVar173 * auVar20._4_4_ + auVar21._4_4_ * fVar219;
  auVar121._8_4_ = fVar147 * auVar19._8_4_ + fVar174 * auVar20._8_4_ + auVar21._8_4_ * fVar220;
  auVar121._12_4_ = fVar171 * auVar19._12_4_ + fVar175 * auVar20._12_4_ + auVar21._12_4_ * fVar221;
  auVar121._16_4_ = fVar222 * auVar19._16_4_ + fVar172 * auVar20._16_4_ + auVar21._16_4_ * fVar218;
  auVar121._20_4_ = fVar223 * auVar19._20_4_ + fVar173 * auVar20._20_4_ + auVar21._20_4_ * fVar219;
  auVar121._24_4_ = fVar147 * auVar19._24_4_ + fVar174 * auVar20._24_4_ + auVar21._24_4_ * fVar220;
  auVar121._28_4_ = fVar198 + auVar17._28_4_ + fVar221;
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar312,auVar91);
  auVar90 = vcmpps_avx(auVar90,auVar164,1);
  auVar14 = vblendvps_avx(auVar312,auVar164,auVar90);
  auVar90 = vandps_avx(auVar305,auVar91);
  auVar90 = vcmpps_avx(auVar90,auVar164,1);
  auVar15 = vblendvps_avx(auVar305,auVar164,auVar90);
  auVar90 = vandps_avx(auVar217,auVar91);
  auVar90 = vcmpps_avx(auVar90,auVar164,1);
  auVar90 = vblendvps_avx(auVar217,auVar164,auVar90);
  auVar16 = vrcpps_avx(auVar14);
  fVar198 = auVar16._0_4_;
  fVar218 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar218;
  auVar17._0_4_ = auVar14._0_4_ * fVar198;
  fVar219 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar219;
  fVar220 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar220;
  fVar221 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar221;
  fVar222 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar222;
  fVar223 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar223;
  auVar17._28_4_ = auVar14._28_4_;
  auVar265._8_4_ = 0x3f800000;
  auVar265._0_8_ = &DAT_3f8000003f800000;
  auVar265._12_4_ = 0x3f800000;
  auVar265._16_4_ = 0x3f800000;
  auVar265._20_4_ = 0x3f800000;
  auVar265._24_4_ = 0x3f800000;
  auVar265._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar265,auVar17);
  fVar198 = fVar198 + fVar198 * auVar17._0_4_;
  fVar218 = fVar218 + fVar218 * auVar17._4_4_;
  fVar219 = fVar219 + fVar219 * auVar17._8_4_;
  fVar220 = fVar220 + fVar220 * auVar17._12_4_;
  fVar221 = fVar221 + fVar221 * auVar17._16_4_;
  fVar222 = fVar222 + fVar222 * auVar17._20_4_;
  fVar223 = fVar223 + fVar223 * auVar17._24_4_;
  auVar14 = vrcpps_avx(auVar15);
  fVar147 = auVar14._0_4_;
  fVar171 = auVar14._4_4_;
  auVar18._4_4_ = fVar171 * auVar15._4_4_;
  auVar18._0_4_ = fVar147 * auVar15._0_4_;
  fVar172 = auVar14._8_4_;
  auVar18._8_4_ = fVar172 * auVar15._8_4_;
  fVar173 = auVar14._12_4_;
  auVar18._12_4_ = fVar173 * auVar15._12_4_;
  fVar174 = auVar14._16_4_;
  auVar18._16_4_ = fVar174 * auVar15._16_4_;
  fVar175 = auVar14._20_4_;
  auVar18._20_4_ = fVar175 * auVar15._20_4_;
  fVar176 = auVar14._24_4_;
  auVar18._24_4_ = fVar176 * auVar15._24_4_;
  auVar18._28_4_ = auVar17._28_4_;
  auVar14 = vsubps_avx(auVar265,auVar18);
  fVar147 = fVar147 + fVar147 * auVar14._0_4_;
  fVar171 = fVar171 + fVar171 * auVar14._4_4_;
  fVar172 = fVar172 + fVar172 * auVar14._8_4_;
  fVar173 = fVar173 + fVar173 * auVar14._12_4_;
  fVar174 = fVar174 + fVar174 * auVar14._16_4_;
  fVar175 = fVar175 + fVar175 * auVar14._20_4_;
  fVar176 = fVar176 + fVar176 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar90);
  fVar177 = auVar14._0_4_;
  fVar192 = auVar14._4_4_;
  auVar15._4_4_ = fVar192 * auVar90._4_4_;
  auVar15._0_4_ = fVar177 * auVar90._0_4_;
  fVar193 = auVar14._8_4_;
  auVar15._8_4_ = fVar193 * auVar90._8_4_;
  fVar194 = auVar14._12_4_;
  auVar15._12_4_ = fVar194 * auVar90._12_4_;
  fVar195 = auVar14._16_4_;
  auVar15._16_4_ = fVar195 * auVar90._16_4_;
  fVar196 = auVar14._20_4_;
  auVar15._20_4_ = fVar196 * auVar90._20_4_;
  fVar197 = auVar14._24_4_;
  auVar15._24_4_ = fVar197 * auVar90._24_4_;
  auVar15._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar265,auVar15);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar77 * 7 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar206);
  fVar177 = fVar177 + fVar177 * auVar90._0_4_;
  fVar192 = fVar192 + fVar192 * auVar90._4_4_;
  fVar193 = fVar193 + fVar193 * auVar90._8_4_;
  fVar194 = fVar194 + fVar194 * auVar90._12_4_;
  fVar195 = fVar195 + fVar195 * auVar90._16_4_;
  fVar196 = fVar196 + fVar196 * auVar90._20_4_;
  fVar197 = fVar197 + fVar197 * auVar90._24_4_;
  auVar92._16_16_ = auVar206;
  auVar92._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar92);
  auVar90 = vsubps_avx(auVar90,auVar235);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + lVar78 + 6);
  auVar111 = vpmovsxwd_avx(auVar215);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar78 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar7);
  auVar85._0_4_ = fVar198 * auVar90._0_4_;
  auVar85._4_4_ = fVar218 * auVar90._4_4_;
  auVar85._8_4_ = fVar219 * auVar90._8_4_;
  auVar85._12_4_ = fVar220 * auVar90._12_4_;
  auVar19._16_4_ = fVar221 * auVar90._16_4_;
  auVar19._0_16_ = auVar85;
  auVar19._20_4_ = fVar222 * auVar90._20_4_;
  auVar19._24_4_ = fVar223 * auVar90._24_4_;
  auVar19._28_4_ = auVar90._28_4_;
  auVar246._16_16_ = auVar206;
  auVar246._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar246);
  auVar90 = vsubps_avx(auVar90,auVar235);
  lVar83 = (ulong)(byte)PVar9 * 0x10;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *(ulong *)(prim + lVar83 + 6);
  auVar111 = vpmovsxwd_avx(auVar299);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar83 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar8);
  lVar83 = lVar83 + uVar77 * -2;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + lVar83 + 6);
  auVar215 = vpmovsxwd_avx(auVar159);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + lVar83 + 0xe);
  auVar7 = vpmovsxwd_avx(auVar110);
  auVar200._0_4_ = fVar198 * auVar90._0_4_;
  auVar200._4_4_ = fVar218 * auVar90._4_4_;
  auVar200._8_4_ = fVar219 * auVar90._8_4_;
  auVar200._12_4_ = fVar220 * auVar90._12_4_;
  auVar20._16_4_ = fVar221 * auVar90._16_4_;
  auVar20._0_16_ = auVar200;
  auVar20._20_4_ = fVar222 * auVar90._20_4_;
  auVar20._24_4_ = fVar223 * auVar90._24_4_;
  auVar20._28_4_ = auVar16._28_4_ + auVar17._28_4_;
  auVar236._16_16_ = auVar7;
  auVar236._0_16_ = auVar215;
  auVar90 = vcvtdq2ps_avx(auVar236);
  auVar90 = vsubps_avx(auVar90,auVar141);
  auVar224._0_4_ = fVar147 * auVar90._0_4_;
  auVar224._4_4_ = fVar171 * auVar90._4_4_;
  auVar224._8_4_ = fVar172 * auVar90._8_4_;
  auVar224._12_4_ = fVar173 * auVar90._12_4_;
  auVar16._16_4_ = fVar174 * auVar90._16_4_;
  auVar16._0_16_ = auVar224;
  auVar16._20_4_ = fVar175 * auVar90._20_4_;
  auVar16._24_4_ = fVar176 * auVar90._24_4_;
  auVar16._28_4_ = auVar90._28_4_;
  auVar247._16_16_ = auVar206;
  auVar247._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar247);
  auVar90 = vsubps_avx(auVar90,auVar141);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar80 + uVar77 + 6);
  auVar111 = vpmovsxwd_avx(auVar158);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 + uVar77 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar88);
  auVar127._0_4_ = fVar147 * auVar90._0_4_;
  auVar127._4_4_ = fVar171 * auVar90._4_4_;
  auVar127._8_4_ = fVar172 * auVar90._8_4_;
  auVar127._12_4_ = fVar173 * auVar90._12_4_;
  auVar21._16_4_ = fVar174 * auVar90._16_4_;
  auVar21._0_16_ = auVar127;
  auVar21._20_4_ = fVar175 * auVar90._20_4_;
  auVar21._24_4_ = fVar176 * auVar90._24_4_;
  auVar21._28_4_ = auVar90._28_4_;
  auVar165._16_16_ = auVar206;
  auVar165._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar165);
  auVar90 = vsubps_avx(auVar90,auVar121);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar111 = vpmovsxwd_avx(auVar133);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar271);
  auVar148._0_4_ = fVar177 * auVar90._0_4_;
  auVar148._4_4_ = fVar192 * auVar90._4_4_;
  auVar148._8_4_ = fVar193 * auVar90._8_4_;
  auVar148._12_4_ = fVar194 * auVar90._12_4_;
  auVar22._16_4_ = fVar195 * auVar90._16_4_;
  auVar22._0_16_ = auVar148;
  auVar22._20_4_ = fVar196 * auVar90._20_4_;
  auVar22._24_4_ = fVar197 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  auVar248._16_16_ = auVar206;
  auVar248._0_16_ = auVar111;
  auVar90 = vcvtdq2ps_avx(auVar248);
  auVar90 = vsubps_avx(auVar90,auVar121);
  auVar102._0_4_ = fVar177 * auVar90._0_4_;
  auVar102._4_4_ = fVar192 * auVar90._4_4_;
  auVar102._8_4_ = fVar193 * auVar90._8_4_;
  auVar102._12_4_ = fVar194 * auVar90._12_4_;
  auVar23._16_4_ = fVar195 * auVar90._16_4_;
  auVar23._0_16_ = auVar102;
  auVar23._20_4_ = fVar196 * auVar90._20_4_;
  auVar23._24_4_ = fVar197 * auVar90._24_4_;
  auVar23._28_4_ = auVar90._28_4_;
  auVar111 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar206 = vpminsd_avx(auVar85,auVar200);
  auVar292._16_16_ = auVar111;
  auVar292._0_16_ = auVar206;
  auVar111 = vpminsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar206 = vpminsd_avx(auVar224,auVar127);
  auVar306._16_16_ = auVar111;
  auVar306._0_16_ = auVar206;
  auVar90 = vmaxps_avx(auVar292,auVar306);
  auVar111 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar206 = vpminsd_avx(auVar148,auVar102);
  auVar329._16_16_ = auVar111;
  auVar329._0_16_ = auVar206;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar340._4_4_ = uVar4;
  auVar340._0_4_ = uVar4;
  auVar340._8_4_ = uVar4;
  auVar340._12_4_ = uVar4;
  auVar340._16_4_ = uVar4;
  auVar340._20_4_ = uVar4;
  auVar340._24_4_ = uVar4;
  auVar340._28_4_ = uVar4;
  auVar14 = vmaxps_avx(auVar329,auVar340);
  auVar90 = vmaxps_avx(auVar90,auVar14);
  local_2a0._4_4_ = auVar90._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar90._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar90._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar90._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar90._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar90._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar90._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar90._28_4_;
  auVar111 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar206 = vpmaxsd_avx(auVar85,auVar200);
  auVar93._16_16_ = auVar111;
  auVar93._0_16_ = auVar206;
  auVar111 = vpmaxsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar206 = vpmaxsd_avx(auVar224,auVar127);
  auVar142._16_16_ = auVar111;
  auVar142._0_16_ = auVar206;
  auVar90 = vminps_avx(auVar93,auVar142);
  auVar111 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar206 = vpmaxsd_avx(auVar148,auVar102);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar166._4_4_ = uVar4;
  auVar166._0_4_ = uVar4;
  auVar166._8_4_ = uVar4;
  auVar166._12_4_ = uVar4;
  auVar166._16_4_ = uVar4;
  auVar166._20_4_ = uVar4;
  auVar166._24_4_ = uVar4;
  auVar166._28_4_ = uVar4;
  auVar122._16_16_ = auVar111;
  auVar122._0_16_ = auVar206;
  auVar14 = vminps_avx(auVar122,auVar166);
  auVar90 = vminps_avx(auVar90,auVar14);
  auVar14._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_2a0,auVar14,2);
  auVar111 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar123._16_16_ = auVar111;
  auVar123._0_16_ = auVar111;
  auVar14 = vcvtdq2ps_avx(auVar123);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar90 = vandps_avx(auVar90,auVar14);
  uVar75 = vmovmskps_avx(auVar90);
  local_721 = uVar75 != 0;
  if (uVar75 == 0) {
    return local_721;
  }
  uVar75 = uVar75 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  uVar82 = 1 << ((byte)k & 0x1f);
  local_320 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  uVar77 = (ulong)((uVar82 & 0xf) << 4);
  lVar83 = (long)((int)uVar82 >> 4) * 0x10;
  auVar341 = ZEXT1664((undefined1  [16])0x0);
LAB_01142949:
  lVar78 = 0;
  if (uVar75 != 0) {
    for (; (uVar75 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
    }
  }
  uVar82 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar82].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  uVar80 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(prim + lVar78 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar11 + (long)pGVar10[1].intersectionFilterN * uVar80);
  fVar171 = *pfVar2;
  fVar172 = pfVar2[1];
  fVar173 = pfVar2[2];
  fVar174 = pfVar2[3];
  lVar1 = uVar80 + 1;
  auVar111 = *(undefined1 (*) [16])(lVar11 + (long)pGVar10[1].intersectionFilterN * lVar1);
  pfVar2 = (float *)(pGVar10[2].intersectionFilterN + (long)pGVar10[2].pointQueryFunc * uVar80);
  _Var12 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(pGVar10[2].intersectionFilterN + (long)pGVar10[2].pointQueryFunc * lVar1);
  auVar128._0_4_ = *pfVar3 * 0.33333334;
  auVar128._4_4_ = pfVar3[1] * 0.33333334;
  auVar128._8_4_ = pfVar3[2] * 0.33333334;
  auVar128._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)(_Var12 + (long)pGVar10[2].userPtr * uVar80);
  fVar175 = *pfVar3;
  fVar176 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar192 = pfVar3[3];
  auVar206 = *(undefined1 (*) [16])(_Var12 + (long)pGVar10[2].userPtr * lVar1);
  pfVar3 = (float *)((long)pGVar10[3].userPtr + uVar80 * *(long *)&pGVar10[3].fnumTimeSegments);
  auVar215 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar215 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar193 = fVar171 + *pfVar2 * 0.33333334;
  fVar194 = fVar172 + pfVar2[1] * 0.33333334;
  fVar195 = fVar173 + pfVar2[2] * 0.33333334;
  fVar196 = fVar174 + pfVar2[3] * 0.33333334;
  auVar7 = vsubps_avx(auVar111,auVar128);
  pfVar2 = (float *)((long)pGVar10[3].userPtr + *(long *)&pGVar10[3].fnumTimeSegments * lVar1);
  auVar103._0_4_ = *pfVar2 * 0.33333334;
  auVar103._4_4_ = pfVar2[1] * 0.33333334;
  auVar103._8_4_ = pfVar2[2] * 0.33333334;
  auVar103._12_4_ = pfVar2[3] * 0.33333334;
  fVar197 = fVar175 + *pfVar3 * 0.33333334;
  fVar294 = fVar176 + pfVar3[1] * 0.33333334;
  fVar295 = fVar177 + pfVar3[2] * 0.33333334;
  fVar296 = fVar192 + pfVar3[3] * 0.33333334;
  auVar299 = vsubps_avx(auVar206,auVar103);
  fVar198 = auVar111._0_4_;
  fVar219 = auVar111._4_4_;
  fVar221 = auVar111._8_4_;
  fVar336 = auVar341._8_4_;
  fVar223 = auVar111._12_4_;
  fVar342 = auVar341._12_4_;
  fVar297 = auVar7._0_4_ * 0.0;
  fVar307 = auVar7._4_4_ * 0.0;
  fVar308 = auVar7._8_4_ * fVar336;
  fVar309 = auVar7._12_4_ * fVar342;
  fVar218 = fVar297 + fVar198 * 0.0;
  fVar220 = fVar307 + fVar219 * 0.0;
  fVar222 = fVar308 + fVar336 * fVar221;
  fVar147 = fVar309 + fVar342 * fVar223;
  fVar310 = fVar193 * 0.0;
  fVar313 = fVar194 * 0.0;
  fVar314 = fVar195 * fVar336;
  fVar315 = fVar196 * fVar342;
  local_6e0._0_4_ = fVar171 + fVar310 + fVar218;
  local_6e0._4_4_ = fVar172 + fVar313 + fVar220;
  fStack_6d8 = fVar173 + fVar314 + fVar222;
  fStack_6d4 = fVar174 + fVar315 + fVar147;
  auVar129._0_4_ = fVar193 * 3.0 + fVar218;
  auVar129._4_4_ = fVar194 * 3.0 + fVar220;
  auVar129._8_4_ = fVar195 * 3.0 + fVar222;
  auVar129._12_4_ = fVar196 * 3.0 + fVar147;
  auVar250._0_4_ = fVar171 * 3.0;
  auVar250._4_4_ = fVar172 * 3.0;
  auVar250._8_4_ = fVar173 * 3.0;
  auVar250._12_4_ = fVar174 * 3.0;
  auVar158 = vsubps_avx(auVar129,auVar250);
  fVar218 = auVar206._0_4_;
  fVar220 = auVar206._4_4_;
  fVar222 = auVar206._8_4_;
  fVar147 = auVar206._12_4_;
  fVar323 = auVar299._0_4_ * 0.0;
  fVar331 = auVar299._4_4_ * 0.0;
  fVar332 = fVar336 * auVar299._8_4_;
  fVar333 = fVar342 * auVar299._12_4_;
  fVar193 = fVar218 * 0.0 + fVar323;
  fVar194 = fVar220 * 0.0 + fVar331;
  fVar195 = fVar336 * fVar222 + fVar332;
  fVar196 = fVar342 * fVar147 + fVar333;
  fVar336 = fVar197 * 0.0;
  fVar342 = fVar294 * 0.0;
  fVar344 = fVar295 * 0.0;
  fVar346 = fVar296 * 0.0;
  auVar347._0_4_ = fVar336 + fVar193 + fVar175;
  auVar347._4_4_ = fVar342 + fVar194 + fVar176;
  auVar347._8_4_ = fVar344 + fVar195 + fVar177;
  auVar347._12_4_ = fVar346 + fVar196 + fVar192;
  auVar251._0_4_ = fVar197 * 3.0 + fVar193;
  auVar251._4_4_ = fVar294 * 3.0 + fVar194;
  auVar251._8_4_ = fVar295 * 3.0 + fVar195;
  auVar251._12_4_ = fVar296 * 3.0 + fVar196;
  auVar284._0_4_ = fVar175 * 3.0;
  auVar284._4_4_ = fVar176 * 3.0;
  auVar284._8_4_ = fVar177 * 3.0;
  auVar284._12_4_ = fVar192 * 3.0;
  auVar8 = vsubps_avx(auVar251,auVar284);
  auVar298._0_4_ = fVar171 * 0.0;
  auVar298._4_4_ = fVar172 * 0.0;
  auVar298._8_4_ = fVar173 * 0.0;
  auVar298._12_4_ = fVar174 * 0.0;
  auVar149._0_4_ = auVar298._0_4_ + fVar310 + fVar297 + fVar198;
  auVar149._4_4_ = auVar298._4_4_ + fVar313 + fVar307 + fVar219;
  auVar149._8_4_ = auVar298._8_4_ + fVar314 + fVar308 + fVar221;
  auVar149._12_4_ = auVar298._12_4_ + fVar315 + fVar309 + fVar223;
  auVar178._0_4_ = fVar198 * 3.0;
  auVar178._4_4_ = fVar219 * 3.0;
  auVar178._8_4_ = fVar221 * 3.0;
  auVar178._12_4_ = fVar223 * 3.0;
  auVar252._0_4_ = auVar7._0_4_ * 3.0;
  auVar252._4_4_ = auVar7._4_4_ * 3.0;
  auVar252._8_4_ = auVar7._8_4_ * 3.0;
  auVar252._12_4_ = auVar7._12_4_ * 3.0;
  auVar111 = vsubps_avx(auVar178,auVar252);
  auVar179._0_4_ = fVar310 + auVar111._0_4_;
  auVar179._4_4_ = fVar313 + auVar111._4_4_;
  auVar179._8_4_ = fVar314 + auVar111._8_4_;
  auVar179._12_4_ = fVar315 + auVar111._12_4_;
  auVar88 = vsubps_avx(auVar179,auVar298);
  auVar201._0_4_ = fVar175 * 0.0;
  auVar201._4_4_ = fVar176 * 0.0;
  auVar201._8_4_ = fVar177 * 0.0;
  auVar201._12_4_ = fVar192 * 0.0;
  auVar268._0_4_ = fVar336 + fVar323 + fVar218 + auVar201._0_4_;
  auVar268._4_4_ = fVar342 + fVar331 + fVar220 + auVar201._4_4_;
  auVar268._8_4_ = fVar344 + fVar332 + fVar222 + auVar201._8_4_;
  auVar268._12_4_ = fVar346 + fVar333 + fVar147 + auVar201._12_4_;
  auVar225._0_4_ = fVar218 * 3.0;
  auVar225._4_4_ = fVar220 * 3.0;
  auVar225._8_4_ = fVar222 * 3.0;
  auVar225._12_4_ = fVar147 * 3.0;
  auVar238._0_4_ = auVar299._0_4_ * 3.0;
  auVar238._4_4_ = auVar299._4_4_ * 3.0;
  auVar238._8_4_ = auVar299._8_4_ * 3.0;
  auVar238._12_4_ = auVar299._12_4_ * 3.0;
  auVar111 = vsubps_avx(auVar225,auVar238);
  auVar226._0_4_ = fVar336 + auVar111._0_4_;
  auVar226._4_4_ = fVar342 + auVar111._4_4_;
  auVar226._8_4_ = fVar344 + auVar111._8_4_;
  auVar226._12_4_ = fVar346 + auVar111._12_4_;
  auVar159 = vsubps_avx(auVar226,auVar201);
  auVar111 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar206 = vshufps_avx(auVar347,auVar347,0xc9);
  fVar193 = auVar158._0_4_;
  auVar239._0_4_ = fVar193 * auVar206._0_4_;
  fVar194 = auVar158._4_4_;
  auVar239._4_4_ = fVar194 * auVar206._4_4_;
  fVar195 = auVar158._8_4_;
  auVar239._8_4_ = fVar195 * auVar206._8_4_;
  fVar196 = auVar158._12_4_;
  auVar239._12_4_ = fVar196 * auVar206._12_4_;
  auVar253._0_4_ = auVar347._0_4_ * auVar111._0_4_;
  auVar253._4_4_ = auVar347._4_4_ * auVar111._4_4_;
  auVar253._8_4_ = auVar347._8_4_ * auVar111._8_4_;
  auVar253._12_4_ = auVar347._12_4_ * auVar111._12_4_;
  auVar206 = vsubps_avx(auVar253,auVar239);
  auVar7 = vshufps_avx(auVar206,auVar206,0xc9);
  auVar206 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar240._0_4_ = fVar193 * auVar206._0_4_;
  auVar240._4_4_ = fVar194 * auVar206._4_4_;
  auVar240._8_4_ = fVar195 * auVar206._8_4_;
  auVar240._12_4_ = fVar196 * auVar206._12_4_;
  auVar202._0_4_ = auVar8._0_4_ * auVar111._0_4_;
  auVar202._4_4_ = auVar8._4_4_ * auVar111._4_4_;
  auVar202._8_4_ = auVar8._8_4_ * auVar111._8_4_;
  auVar202._12_4_ = auVar8._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar202,auVar240);
  auVar299 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar111 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar206 = vshufps_avx(auVar268,auVar268,0xc9);
  fVar197 = auVar88._0_4_;
  auVar203._0_4_ = fVar197 * auVar206._0_4_;
  fVar294 = auVar88._4_4_;
  auVar203._4_4_ = fVar294 * auVar206._4_4_;
  fVar295 = auVar88._8_4_;
  auVar203._8_4_ = fVar295 * auVar206._8_4_;
  fVar296 = auVar88._12_4_;
  auVar203._12_4_ = fVar296 * auVar206._12_4_;
  auVar269._0_4_ = auVar268._0_4_ * auVar111._0_4_;
  auVar269._4_4_ = auVar268._4_4_ * auVar111._4_4_;
  auVar269._8_4_ = auVar268._8_4_ * auVar111._8_4_;
  auVar269._12_4_ = auVar268._12_4_ * auVar111._12_4_;
  auVar206 = vsubps_avx(auVar269,auVar203);
  auVar8 = vshufps_avx(auVar206,auVar206,0xc9);
  auVar206 = vshufps_avx(auVar159,auVar159,0xc9);
  auVar270._0_4_ = auVar206._0_4_ * fVar197;
  auVar270._4_4_ = auVar206._4_4_ * fVar294;
  auVar270._8_4_ = auVar206._8_4_ * fVar295;
  auVar270._12_4_ = auVar206._12_4_ * fVar296;
  auVar227._0_4_ = auVar111._0_4_ * auVar159._0_4_;
  auVar227._4_4_ = auVar111._4_4_ * auVar159._4_4_;
  auVar227._8_4_ = auVar111._8_4_ * auVar159._8_4_;
  auVar227._12_4_ = auVar111._12_4_ * auVar159._12_4_;
  auVar111 = vdpps_avx(auVar7,auVar7,0x7f);
  auVar206 = vsubps_avx(auVar227,auVar270);
  auVar159 = vshufps_avx(auVar206,auVar206,0xc9);
  fVar221 = auVar111._0_4_;
  auVar271 = ZEXT416((uint)fVar221);
  auVar206 = vrsqrtss_avx(auVar271,auVar271);
  fVar198 = auVar206._0_4_;
  auVar206 = ZEXT416((uint)(fVar198 * 1.5 - fVar221 * 0.5 * fVar198 * fVar198 * fVar198));
  auVar110 = vshufps_avx(auVar206,auVar206,0);
  fVar198 = auVar7._0_4_ * auVar110._0_4_;
  fVar218 = auVar7._4_4_ * auVar110._4_4_;
  fVar219 = auVar7._8_4_ * auVar110._8_4_;
  fVar220 = auVar7._12_4_ * auVar110._12_4_;
  auVar206 = vdpps_avx(auVar7,auVar299,0x7f);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar285._0_4_ = auVar111._0_4_ * auVar299._0_4_;
  auVar285._4_4_ = auVar111._4_4_ * auVar299._4_4_;
  auVar285._8_4_ = auVar111._8_4_ * auVar299._8_4_;
  auVar285._12_4_ = auVar111._12_4_ * auVar299._12_4_;
  auVar111 = vshufps_avx(auVar206,auVar206,0);
  auVar254._0_4_ = auVar111._0_4_ * auVar7._0_4_;
  auVar254._4_4_ = auVar111._4_4_ * auVar7._4_4_;
  auVar254._8_4_ = auVar111._8_4_ * auVar7._8_4_;
  auVar254._12_4_ = auVar111._12_4_ * auVar7._12_4_;
  auVar133 = vsubps_avx(auVar285,auVar254);
  auVar111 = vrcpss_avx(auVar271,auVar271);
  auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar221 * auVar111._0_4_)));
  auVar7 = vshufps_avx(auVar111,auVar111,0);
  auVar111 = vdpps_avx(auVar8,auVar8,0x7f);
  fVar221 = auVar111._0_4_;
  auVar271 = ZEXT416((uint)fVar221);
  auVar206 = vrsqrtss_avx(auVar271,auVar271);
  fVar222 = auVar206._0_4_;
  auVar206 = vdpps_avx(auVar8,auVar159,0x7f);
  auVar299 = ZEXT416((uint)(fVar222 * 1.5 - fVar221 * 0.5 * fVar222 * fVar222 * fVar222));
  auVar299 = vshufps_avx(auVar299,auVar299,0);
  fVar222 = auVar299._0_4_ * auVar8._0_4_;
  fVar223 = auVar299._4_4_ * auVar8._4_4_;
  fVar147 = auVar299._8_4_ * auVar8._8_4_;
  fVar171 = auVar299._12_4_ * auVar8._12_4_;
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar241._0_4_ = auVar111._0_4_ * auVar159._0_4_;
  auVar241._4_4_ = auVar111._4_4_ * auVar159._4_4_;
  auVar241._8_4_ = auVar111._8_4_ * auVar159._8_4_;
  auVar241._12_4_ = auVar111._12_4_ * auVar159._12_4_;
  auVar111 = vshufps_avx(auVar206,auVar206,0);
  auVar204._0_4_ = auVar111._0_4_ * auVar8._0_4_;
  auVar204._4_4_ = auVar111._4_4_ * auVar8._4_4_;
  auVar204._8_4_ = auVar111._8_4_ * auVar8._8_4_;
  auVar204._12_4_ = auVar111._12_4_ * auVar8._12_4_;
  auVar159 = vsubps_avx(auVar241,auVar204);
  auVar111 = vrcpss_avx(auVar271,auVar271);
  auVar111 = ZEXT416((uint)((2.0 - fVar221 * auVar111._0_4_) * auVar111._0_4_));
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar206 = vshufps_avx(_local_6e0,_local_6e0,0xff);
  auVar272._0_4_ = auVar206._0_4_ * fVar198;
  auVar272._4_4_ = auVar206._4_4_ * fVar218;
  auVar272._8_4_ = auVar206._8_4_ * fVar219;
  auVar272._12_4_ = auVar206._12_4_ * fVar220;
  _local_4a0 = vsubps_avx(_local_6e0,auVar272);
  auVar8 = vshufps_avx(auVar158,auVar158,0xff);
  auVar228._0_4_ =
       auVar8._0_4_ * fVar198 + auVar110._0_4_ * auVar133._0_4_ * auVar7._0_4_ * auVar206._0_4_;
  auVar228._4_4_ =
       auVar8._4_4_ * fVar218 + auVar110._4_4_ * auVar133._4_4_ * auVar7._4_4_ * auVar206._4_4_;
  auVar228._8_4_ =
       auVar8._8_4_ * fVar219 + auVar110._8_4_ * auVar133._8_4_ * auVar7._8_4_ * auVar206._8_4_;
  auVar228._12_4_ =
       auVar8._12_4_ * fVar220 + auVar110._12_4_ * auVar133._12_4_ * auVar7._12_4_ * auVar206._12_4_
  ;
  auVar8 = vsubps_avx(auVar158,auVar228);
  local_4b0._0_4_ = auVar272._0_4_ + (float)local_6e0._0_4_;
  local_4b0._4_4_ = auVar272._4_4_ + (float)local_6e0._4_4_;
  fStack_4a8 = auVar272._8_4_ + fStack_6d8;
  fStack_4a4 = auVar272._12_4_ + fStack_6d4;
  auVar206 = vshufps_avx(auVar149,auVar149,0xff);
  auVar130._0_4_ = fVar222 * auVar206._0_4_;
  auVar130._4_4_ = fVar223 * auVar206._4_4_;
  auVar130._8_4_ = fVar147 * auVar206._8_4_;
  auVar130._12_4_ = fVar171 * auVar206._12_4_;
  _local_4c0 = vsubps_avx(auVar149,auVar130);
  auVar7 = vshufps_avx(auVar88,auVar88,0xff);
  auVar104._0_4_ =
       fVar222 * auVar7._0_4_ + auVar206._0_4_ * auVar299._0_4_ * auVar159._0_4_ * auVar111._0_4_;
  auVar104._4_4_ =
       fVar223 * auVar7._4_4_ + auVar206._4_4_ * auVar299._4_4_ * auVar159._4_4_ * auVar111._4_4_;
  auVar104._8_4_ =
       fVar147 * auVar7._8_4_ + auVar206._8_4_ * auVar299._8_4_ * auVar159._8_4_ * auVar111._8_4_;
  auVar104._12_4_ =
       fVar171 * auVar7._12_4_ +
       auVar206._12_4_ * auVar299._12_4_ * auVar159._12_4_ * auVar111._12_4_;
  auVar299 = vsubps_avx(auVar88,auVar104);
  local_4d0._0_4_ = auVar149._0_4_ + auVar130._0_4_;
  local_4d0._4_4_ = auVar149._4_4_ + auVar130._4_4_;
  fStack_4c8 = auVar149._8_4_ + auVar130._8_4_;
  fStack_4c4 = auVar149._12_4_ + auVar130._12_4_;
  local_4e0._0_4_ = local_4a0._0_4_ + auVar8._0_4_ * 0.33333334;
  local_4e0._4_4_ = local_4a0._4_4_ + auVar8._4_4_ * 0.33333334;
  fStack_4d8 = local_4a0._8_4_ + auVar8._8_4_ * 0.33333334;
  fStack_4d4 = local_4a0._12_4_ + auVar8._12_4_ * 0.33333334;
  local_360 = vsubps_avx(_local_4a0,auVar215);
  auVar206 = vmovsldup_avx(local_360);
  auVar111 = vmovshdup_avx(local_360);
  auVar7 = vshufps_avx(local_360,local_360,0xaa);
  fVar198 = pre->ray_space[k].vx.field_0.m128[0];
  fVar218 = pre->ray_space[k].vx.field_0.m128[1];
  fVar219 = pre->ray_space[k].vx.field_0.m128[2];
  fVar220 = pre->ray_space[k].vx.field_0.m128[3];
  fVar221 = pre->ray_space[k].vy.field_0.m128[0];
  fVar222 = pre->ray_space[k].vy.field_0.m128[1];
  fVar223 = pre->ray_space[k].vy.field_0.m128[2];
  fVar147 = pre->ray_space[k].vy.field_0.m128[3];
  fVar171 = pre->ray_space[k].vz.field_0.m128[0];
  fVar172 = pre->ray_space[k].vz.field_0.m128[1];
  fVar173 = pre->ray_space[k].vz.field_0.m128[2];
  fVar174 = pre->ray_space[k].vz.field_0.m128[3];
  fVar175 = fVar198 * auVar206._0_4_ + auVar7._0_4_ * fVar171 + fVar221 * auVar111._0_4_;
  fVar177 = fVar218 * auVar206._4_4_ + auVar7._4_4_ * fVar172 + fVar222 * auVar111._4_4_;
  local_6e0._4_4_ = fVar177;
  local_6e0._0_4_ = fVar175;
  fStack_6d8 = fVar219 * auVar206._8_4_ + auVar7._8_4_ * fVar173 + fVar223 * auVar111._8_4_;
  fStack_6d4 = fVar220 * auVar206._12_4_ + auVar7._12_4_ * fVar174 + fVar147 * auVar111._12_4_;
  local_370 = vsubps_avx(_local_4e0,auVar215);
  auVar7 = vshufps_avx(local_370,local_370,0xaa);
  auVar111 = vmovshdup_avx(local_370);
  auVar206 = vmovsldup_avx(local_370);
  fVar176 = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + fVar171 * auVar7._0_4_;
  fVar192 = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + fVar172 * auVar7._4_4_;
  local_6a0._4_4_ = fVar192;
  local_6a0._0_4_ = fVar176;
  fStack_698 = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + fVar173 * auVar7._8_4_;
  fStack_694 = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + fVar174 * auVar7._12_4_;
  auVar205._0_4_ = auVar299._0_4_ * 0.33333334;
  auVar205._4_4_ = auVar299._4_4_ * 0.33333334;
  auVar205._8_4_ = auVar299._8_4_ * 0.33333334;
  auVar205._12_4_ = auVar299._12_4_ * 0.33333334;
  _local_4f0 = vsubps_avx(_local_4c0,auVar205);
  local_380 = vsubps_avx(_local_4f0,auVar215);
  auVar7 = vshufps_avx(local_380,local_380,0xaa);
  auVar111 = vmovshdup_avx(local_380);
  auVar206 = vmovsldup_avx(local_380);
  auVar338._0_4_ = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + fVar171 * auVar7._0_4_;
  auVar338._4_4_ = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + fVar172 * auVar7._4_4_;
  auVar338._8_4_ = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + fVar173 * auVar7._8_4_;
  auVar338._12_4_ = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + fVar174 * auVar7._12_4_;
  local_390 = vsubps_avx(_local_4c0,auVar215);
  auVar7 = vshufps_avx(local_390,local_390,0xaa);
  auVar111 = vmovshdup_avx(local_390);
  auVar206 = vmovsldup_avx(local_390);
  auVar324._0_4_ = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + auVar7._0_4_ * fVar171;
  auVar324._4_4_ = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + auVar7._4_4_ * fVar172;
  auVar324._8_4_ = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + auVar7._8_4_ * fVar173;
  auVar324._12_4_ = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + auVar7._12_4_ * fVar174;
  local_3a0 = vsubps_avx(_local_4b0,auVar215);
  auVar7 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar111 = vmovshdup_avx(local_3a0);
  auVar206 = vmovsldup_avx(local_3a0);
  auVar286._0_4_ = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + auVar7._0_4_ * fVar171;
  auVar286._4_4_ = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + auVar7._4_4_ * fVar172;
  auVar286._8_4_ = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + auVar7._8_4_ * fVar173;
  auVar286._12_4_ = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + auVar7._12_4_ * fVar174;
  local_500._0_4_ = (float)local_4b0._0_4_ + (fVar193 + auVar228._0_4_) * 0.33333334;
  local_500._4_4_ = (float)local_4b0._4_4_ + (fVar194 + auVar228._4_4_) * 0.33333334;
  fStack_4f8 = fStack_4a8 + (fVar195 + auVar228._8_4_) * 0.33333334;
  fStack_4f4 = fStack_4a4 + (fVar196 + auVar228._12_4_) * 0.33333334;
  local_3b0 = vsubps_avx(_local_500,auVar215);
  auVar7 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar111 = vmovshdup_avx(local_3b0);
  auVar206 = vmovsldup_avx(local_3b0);
  auVar255._0_4_ = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + auVar7._0_4_ * fVar171;
  auVar255._4_4_ = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + auVar7._4_4_ * fVar172;
  auVar255._8_4_ = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + auVar7._8_4_ * fVar173;
  auVar255._12_4_ = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + auVar7._12_4_ * fVar174;
  auVar242._0_4_ = (fVar197 + auVar104._0_4_) * 0.33333334;
  auVar242._4_4_ = (fVar294 + auVar104._4_4_) * 0.33333334;
  auVar242._8_4_ = (fVar295 + auVar104._8_4_) * 0.33333334;
  auVar242._12_4_ = (fVar296 + auVar104._12_4_) * 0.33333334;
  _local_3e0 = vsubps_avx(_local_4d0,auVar242);
  local_3c0 = vsubps_avx(_local_3e0,auVar215);
  auVar7 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar111 = vmovshdup_avx(local_3c0);
  auVar206 = vmovsldup_avx(local_3c0);
  auVar105._0_4_ = auVar206._0_4_ * fVar198 + auVar111._0_4_ * fVar221 + fVar171 * auVar7._0_4_;
  auVar105._4_4_ = auVar206._4_4_ * fVar218 + auVar111._4_4_ * fVar222 + fVar172 * auVar7._4_4_;
  auVar105._8_4_ = auVar206._8_4_ * fVar219 + auVar111._8_4_ * fVar223 + fVar173 * auVar7._8_4_;
  auVar105._12_4_ = auVar206._12_4_ * fVar220 + auVar111._12_4_ * fVar147 + fVar174 * auVar7._12_4_;
  local_3d0 = vsubps_avx(_local_4d0,auVar215);
  auVar215 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar111 = vmovshdup_avx(local_3d0);
  auVar206 = vmovsldup_avx(local_3d0);
  auVar86._0_4_ = fVar198 * auVar206._0_4_ + fVar221 * auVar111._0_4_ + fVar171 * auVar215._0_4_;
  auVar86._4_4_ = fVar218 * auVar206._4_4_ + fVar222 * auVar111._4_4_ + fVar172 * auVar215._4_4_;
  auVar86._8_4_ = fVar219 * auVar206._8_4_ + fVar223 * auVar111._8_4_ + fVar173 * auVar215._8_4_;
  auVar86._12_4_ = fVar220 * auVar206._12_4_ + fVar147 * auVar111._12_4_ + fVar174 * auVar215._12_4_
  ;
  auVar7 = vmovlhps_avx(_local_6e0,auVar286);
  auVar299 = vmovlhps_avx(_local_6a0,auVar255);
  auVar8 = vmovlhps_avx(auVar338,auVar105);
  _local_490 = vmovlhps_avx(auVar324,auVar86);
  auVar111 = vminps_avx(auVar7,auVar299);
  auVar206 = vminps_avx(auVar8,_local_490);
  auVar215 = vminps_avx(auVar111,auVar206);
  auVar111 = vmaxps_avx(auVar7,auVar299);
  auVar206 = vmaxps_avx(auVar8,_local_490);
  auVar111 = vmaxps_avx(auVar111,auVar206);
  auVar206 = vshufpd_avx(auVar215,auVar215,3);
  auVar215 = vminps_avx(auVar215,auVar206);
  auVar206 = vshufpd_avx(auVar111,auVar111,3);
  auVar206 = vmaxps_avx(auVar111,auVar206);
  auVar229._8_4_ = 0x7fffffff;
  auVar229._0_8_ = 0x7fffffff7fffffff;
  auVar229._12_4_ = 0x7fffffff;
  auVar111 = vandps_avx(auVar215,auVar229);
  auVar206 = vandps_avx(auVar206,auVar229);
  auVar111 = vmaxps_avx(auVar111,auVar206);
  auVar206 = vmovshdup_avx(auVar111);
  auVar111 = vmaxss_avx(auVar206,auVar111);
  local_548 = uVar75 + 0xff;
  fVar218 = auVar111._0_4_ * 9.536743e-07;
  auVar111 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
  local_260._16_16_ = auVar111;
  local_260._0_16_ = auVar111;
  auVar87._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
  auVar87._8_4_ = auVar111._8_4_ ^ 0x80000000;
  auVar87._12_4_ = auVar111._12_4_ ^ 0x80000000;
  local_280._16_16_ = auVar87;
  local_280._0_16_ = auVar87;
  auVar111 = vpshufd_avx(ZEXT416(uVar82),0);
  local_2c0._16_16_ = auVar111;
  local_2c0._0_16_ = auVar111;
  auVar111 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar78 * 4 + 6)),0);
  local_2e0._16_16_ = auVar111;
  local_2e0._0_16_ = auVar111;
  bVar74 = false;
  uVar80 = 0;
  fVar198 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar299,auVar7);
  _local_340 = vsubps_avx(auVar8,auVar299);
  _local_350 = vsubps_avx(_local_490,auVar8);
  _local_3f0 = vsubps_avx(_local_4b0,_local_4a0);
  _local_400 = vsubps_avx(_local_500,_local_4e0);
  _local_410 = vsubps_avx(_local_3e0,_local_4f0);
  _local_420 = vsubps_avx(_local_4d0,_local_4c0);
  _local_6e0 = ZEXT816(0x3f80000000000000);
  auVar111 = _local_6e0;
  do {
    auVar206 = vshufps_avx(_local_6e0,_local_6e0,0x50);
    auVar348._8_4_ = 0x3f800000;
    auVar348._0_8_ = &DAT_3f8000003f800000;
    auVar348._12_4_ = 0x3f800000;
    auVar351._16_4_ = 0x3f800000;
    auVar351._0_16_ = auVar348;
    auVar351._20_4_ = 0x3f800000;
    auVar351._24_4_ = 0x3f800000;
    auVar351._28_4_ = 0x3f800000;
    auVar215 = vsubps_avx(auVar348,auVar206);
    fVar219 = auVar206._0_4_;
    fVar221 = auVar206._4_4_;
    fVar223 = auVar206._8_4_;
    fVar171 = auVar206._12_4_;
    fVar220 = auVar215._0_4_;
    fVar222 = auVar215._4_4_;
    fVar147 = auVar215._8_4_;
    fVar172 = auVar215._12_4_;
    auVar131._0_4_ = auVar286._0_4_ * fVar219 + fVar175 * fVar220;
    auVar131._4_4_ = auVar286._4_4_ * fVar221 + fVar177 * fVar222;
    auVar131._8_4_ = auVar286._0_4_ * fVar223 + fVar175 * fVar147;
    auVar131._12_4_ = auVar286._4_4_ * fVar171 + fVar177 * fVar172;
    auVar106._0_4_ = auVar255._0_4_ * fVar219 + fVar176 * fVar220;
    auVar106._4_4_ = auVar255._4_4_ * fVar221 + fVar192 * fVar222;
    auVar106._8_4_ = auVar255._0_4_ * fVar223 + fVar176 * fVar147;
    auVar106._12_4_ = auVar255._4_4_ * fVar171 + fVar192 * fVar172;
    auVar180._0_4_ = auVar105._0_4_ * fVar219 + auVar338._0_4_ * fVar220;
    auVar180._4_4_ = auVar105._4_4_ * fVar221 + auVar338._4_4_ * fVar222;
    auVar180._8_4_ = auVar105._0_4_ * fVar223 + auVar338._0_4_ * fVar147;
    auVar180._12_4_ = auVar105._4_4_ * fVar171 + auVar338._4_4_ * fVar172;
    auVar150._0_4_ = auVar86._0_4_ * fVar219 + auVar324._0_4_ * fVar220;
    auVar150._4_4_ = auVar86._4_4_ * fVar221 + auVar324._4_4_ * fVar222;
    auVar150._8_4_ = auVar86._0_4_ * fVar223 + auVar324._0_4_ * fVar147;
    auVar150._12_4_ = auVar86._4_4_ * fVar171 + auVar324._4_4_ * fVar172;
    auVar206 = vmovshdup_avx(auVar111);
    auVar215 = vshufps_avx(auVar111,auVar111,0);
    auVar266._16_16_ = auVar215;
    auVar266._0_16_ = auVar215;
    auVar159 = vshufps_avx(auVar111,auVar111,0x55);
    auVar95._16_16_ = auVar159;
    auVar95._0_16_ = auVar159;
    auVar90 = vsubps_avx(auVar95,auVar266);
    auVar159 = vshufps_avx(auVar131,auVar131,0);
    auVar110 = vshufps_avx(auVar131,auVar131,0x55);
    auVar158 = vshufps_avx(auVar106,auVar106,0);
    auVar88 = vshufps_avx(auVar106,auVar106,0x55);
    auVar133 = vshufps_avx(auVar180,auVar180,0);
    auVar271 = vshufps_avx(auVar180,auVar180,0x55);
    auVar85 = vshufps_avx(auVar150,auVar150,0);
    auVar101 = vshufps_avx(auVar150,auVar150,0x55);
    auVar206 = ZEXT416((uint)((auVar206._0_4_ - auVar111._0_4_) * 0.04761905));
    auVar206 = vshufps_avx(auVar206,auVar206,0);
    auVar283._0_4_ = auVar215._0_4_ + auVar90._0_4_ * 0.0;
    auVar283._4_4_ = auVar215._4_4_ + auVar90._4_4_ * 0.14285715;
    auVar283._8_4_ = auVar215._8_4_ + auVar90._8_4_ * 0.2857143;
    auVar283._12_4_ = auVar215._12_4_ + auVar90._12_4_ * 0.42857146;
    auVar283._16_4_ = auVar215._0_4_ + auVar90._16_4_ * 0.5714286;
    auVar283._20_4_ = auVar215._4_4_ + auVar90._20_4_ * 0.71428573;
    auVar283._24_4_ = auVar215._8_4_ + auVar90._24_4_ * 0.8571429;
    auVar283._28_4_ = auVar215._12_4_ + auVar90._28_4_;
    auVar15 = vsubps_avx(auVar351,auVar283);
    fVar196 = auVar158._0_4_;
    fVar294 = auVar158._4_4_;
    fVar308 = auVar158._8_4_;
    fVar310 = auVar158._12_4_;
    fVar219 = auVar15._0_4_;
    fVar223 = auVar15._4_4_;
    fVar173 = auVar15._8_4_;
    fVar195 = auVar15._12_4_;
    fVar334 = auVar159._12_4_;
    fVar295 = auVar15._16_4_;
    fVar296 = auVar15._20_4_;
    fVar297 = auVar15._24_4_;
    fVar331 = auVar88._0_4_;
    fVar333 = auVar88._4_4_;
    fVar342 = auVar88._8_4_;
    fVar322 = auVar88._12_4_;
    local_6a0._0_4_ = auVar110._0_4_;
    local_6a0._4_4_ = auVar110._4_4_;
    fStack_698 = auVar110._8_4_;
    fStack_694 = auVar110._12_4_;
    fVar220 = auVar133._0_4_;
    fVar222 = auVar133._4_4_;
    fVar171 = auVar133._8_4_;
    fVar174 = auVar133._12_4_;
    fVar197 = auVar283._0_4_ * fVar220 + fVar196 * fVar219;
    fVar307 = auVar283._4_4_ * fVar222 + fVar294 * fVar223;
    fVar309 = auVar283._8_4_ * fVar171 + fVar308 * fVar173;
    fVar313 = auVar283._12_4_ * fVar174 + fVar310 * fVar195;
    fVar314 = auVar283._16_4_ * fVar220 + fVar196 * fVar295;
    fVar315 = auVar283._20_4_ * fVar222 + fVar294 * fVar296;
    fVar323 = auVar283._24_4_ * fVar171 + fVar308 * fVar297;
    fVar221 = auVar271._0_4_;
    fVar147 = auVar271._4_4_;
    fVar172 = auVar271._8_4_;
    fVar193 = auVar271._12_4_;
    fVar332 = auVar283._0_4_ * fVar221 + fVar331 * fVar219;
    fVar336 = auVar283._4_4_ * fVar147 + fVar333 * fVar223;
    fVar344 = auVar283._8_4_ * fVar172 + fVar342 * fVar173;
    fVar346 = auVar283._12_4_ * fVar193 + fVar322 * fVar195;
    fVar316 = auVar283._16_4_ * fVar221 + fVar331 * fVar295;
    fVar318 = auVar283._20_4_ * fVar147 + fVar333 * fVar296;
    fVar320 = auVar283._24_4_ * fVar172 + fVar342 * fVar297;
    auVar215 = vshufps_avx(auVar131,auVar131,0xaa);
    auVar110 = vshufps_avx(auVar131,auVar131,0xff);
    fVar194 = fVar174 + 0.0;
    auVar158 = vshufps_avx(auVar106,auVar106,0xaa);
    auVar88 = vshufps_avx(auVar106,auVar106,0xff);
    auVar96._0_4_ =
         fVar219 * (fVar196 * auVar283._0_4_ + auVar159._0_4_ * fVar219) + auVar283._0_4_ * fVar197;
    auVar96._4_4_ =
         fVar223 * (fVar294 * auVar283._4_4_ + auVar159._4_4_ * fVar223) + auVar283._4_4_ * fVar307;
    auVar96._8_4_ =
         fVar173 * (fVar308 * auVar283._8_4_ + auVar159._8_4_ * fVar173) + auVar283._8_4_ * fVar309;
    auVar96._12_4_ =
         fVar195 * (fVar310 * auVar283._12_4_ + fVar334 * fVar195) + auVar283._12_4_ * fVar313;
    auVar96._16_4_ =
         fVar295 * (fVar196 * auVar283._16_4_ + auVar159._0_4_ * fVar295) +
         auVar283._16_4_ * fVar314;
    auVar96._20_4_ =
         fVar296 * (fVar294 * auVar283._20_4_ + auVar159._4_4_ * fVar296) +
         auVar283._20_4_ * fVar315;
    auVar96._24_4_ =
         fVar297 * (fVar308 * auVar283._24_4_ + auVar159._8_4_ * fVar297) +
         auVar283._24_4_ * fVar323;
    auVar96._28_4_ = fVar334 + 1.0 + fVar193;
    auVar167._0_4_ =
         fVar219 * (fVar331 * auVar283._0_4_ + fVar219 * (float)local_6a0._0_4_) +
         auVar283._0_4_ * fVar332;
    auVar167._4_4_ =
         fVar223 * (fVar333 * auVar283._4_4_ + fVar223 * (float)local_6a0._4_4_) +
         auVar283._4_4_ * fVar336;
    auVar167._8_4_ =
         fVar173 * (fVar342 * auVar283._8_4_ + fVar173 * fStack_698) + auVar283._8_4_ * fVar344;
    auVar167._12_4_ =
         fVar195 * (fVar322 * auVar283._12_4_ + fVar195 * fStack_694) + auVar283._12_4_ * fVar346;
    auVar167._16_4_ =
         fVar295 * (fVar331 * auVar283._16_4_ + fVar295 * (float)local_6a0._0_4_) +
         auVar283._16_4_ * fVar316;
    auVar167._20_4_ =
         fVar296 * (fVar333 * auVar283._20_4_ + fVar296 * (float)local_6a0._4_4_) +
         auVar283._20_4_ * fVar318;
    auVar167._24_4_ =
         fVar297 * (fVar342 * auVar283._24_4_ + fVar297 * fStack_698) + auVar283._24_4_ * fVar320;
    auVar167._28_4_ = fVar334 + 1.0 + fVar193;
    auVar189._0_4_ =
         fVar219 * fVar197 + auVar283._0_4_ * (auVar85._0_4_ * auVar283._0_4_ + fVar219 * fVar220);
    auVar189._4_4_ =
         fVar223 * fVar307 + auVar283._4_4_ * (auVar85._4_4_ * auVar283._4_4_ + fVar223 * fVar222);
    auVar189._8_4_ =
         fVar173 * fVar309 + auVar283._8_4_ * (auVar85._8_4_ * auVar283._8_4_ + fVar173 * fVar171);
    auVar189._12_4_ =
         fVar195 * fVar313 +
         auVar283._12_4_ * (auVar85._12_4_ * auVar283._12_4_ + fVar195 * fVar174);
    auVar189._16_4_ =
         fVar295 * fVar314 + auVar283._16_4_ * (auVar85._0_4_ * auVar283._16_4_ + fVar295 * fVar220)
    ;
    auVar189._20_4_ =
         fVar296 * fVar315 + auVar283._20_4_ * (auVar85._4_4_ * auVar283._20_4_ + fVar296 * fVar222)
    ;
    auVar189._24_4_ =
         fVar297 * fVar323 + auVar283._24_4_ * (auVar85._8_4_ * auVar283._24_4_ + fVar297 * fVar171)
    ;
    auVar189._28_4_ = fVar193 + fVar194;
    auVar293._0_4_ =
         fVar219 * fVar332 + auVar283._0_4_ * (auVar101._0_4_ * auVar283._0_4_ + fVar219 * fVar221);
    auVar293._4_4_ =
         fVar223 * fVar336 + auVar283._4_4_ * (auVar101._4_4_ * auVar283._4_4_ + fVar223 * fVar147);
    auVar293._8_4_ =
         fVar173 * fVar344 + auVar283._8_4_ * (auVar101._8_4_ * auVar283._8_4_ + fVar173 * fVar172);
    auVar293._12_4_ =
         fVar195 * fVar346 +
         auVar283._12_4_ * (auVar101._12_4_ * auVar283._12_4_ + fVar195 * fVar193);
    auVar293._16_4_ =
         fVar295 * fVar316 +
         auVar283._16_4_ * (auVar101._0_4_ * auVar283._16_4_ + fVar295 * fVar221);
    auVar293._20_4_ =
         fVar296 * fVar318 +
         auVar283._20_4_ * (auVar101._4_4_ * auVar283._20_4_ + fVar296 * fVar147);
    auVar293._24_4_ =
         fVar297 * fVar320 +
         auVar283._24_4_ * (auVar101._8_4_ * auVar283._24_4_ + fVar297 * fVar172);
    auVar293._28_4_ = fVar194 + fVar193 + 0.0;
    local_440._0_4_ = fVar219 * auVar96._0_4_ + auVar283._0_4_ * auVar189._0_4_;
    local_440._4_4_ = fVar223 * auVar96._4_4_ + auVar283._4_4_ * auVar189._4_4_;
    local_440._8_4_ = fVar173 * auVar96._8_4_ + auVar283._8_4_ * auVar189._8_4_;
    local_440._12_4_ = fVar195 * auVar96._12_4_ + auVar283._12_4_ * auVar189._12_4_;
    local_440._16_4_ = fVar295 * auVar96._16_4_ + auVar283._16_4_ * auVar189._16_4_;
    local_440._20_4_ = fVar296 * auVar96._20_4_ + auVar283._20_4_ * auVar189._20_4_;
    local_440._24_4_ = fVar297 * auVar96._24_4_ + auVar283._24_4_ * auVar189._24_4_;
    local_440._28_4_ = fVar334 + fVar310 + fVar193 + 0.0;
    local_1c0._0_4_ = fVar219 * auVar167._0_4_ + auVar283._0_4_ * auVar293._0_4_;
    local_1c0._4_4_ = fVar223 * auVar167._4_4_ + auVar283._4_4_ * auVar293._4_4_;
    local_1c0._8_4_ = fVar173 * auVar167._8_4_ + auVar283._8_4_ * auVar293._8_4_;
    local_1c0._12_4_ = fVar195 * auVar167._12_4_ + auVar283._12_4_ * auVar293._12_4_;
    local_1c0._16_4_ = fVar295 * auVar167._16_4_ + auVar283._16_4_ * auVar293._16_4_;
    local_1c0._20_4_ = fVar296 * auVar167._20_4_ + auVar283._20_4_ * auVar293._20_4_;
    local_1c0._24_4_ = fVar297 * auVar167._24_4_ + auVar283._24_4_ * auVar293._24_4_;
    local_1c0._28_4_ = fVar334 + fVar310 + fVar194;
    auVar16 = vsubps_avx(auVar189,auVar96);
    auVar90 = vsubps_avx(auVar293,auVar167);
    local_6c0 = auVar206._0_4_;
    fStack_6bc = auVar206._4_4_;
    fStack_6b8 = auVar206._8_4_;
    fStack_6b4 = auVar206._12_4_;
    local_200 = local_6c0 * auVar16._0_4_ * 3.0;
    fStack_1fc = fStack_6bc * auVar16._4_4_ * 3.0;
    auVar24._4_4_ = fStack_1fc;
    auVar24._0_4_ = local_200;
    fStack_1f8 = fStack_6b8 * auVar16._8_4_ * 3.0;
    auVar24._8_4_ = fStack_1f8;
    fStack_1f4 = fStack_6b4 * auVar16._12_4_ * 3.0;
    auVar24._12_4_ = fStack_1f4;
    fStack_1f0 = local_6c0 * auVar16._16_4_ * 3.0;
    auVar24._16_4_ = fStack_1f0;
    fStack_1ec = fStack_6bc * auVar16._20_4_ * 3.0;
    auVar24._20_4_ = fStack_1ec;
    fStack_1e8 = fStack_6b8 * auVar16._24_4_ * 3.0;
    auVar24._24_4_ = fStack_1e8;
    auVar24._28_4_ = auVar16._28_4_;
    fVar307 = local_6c0 * auVar90._0_4_ * 3.0;
    fVar308 = fStack_6bc * auVar90._4_4_ * 3.0;
    auVar25._4_4_ = fVar308;
    auVar25._0_4_ = fVar307;
    fVar309 = fStack_6b8 * auVar90._8_4_ * 3.0;
    auVar25._8_4_ = fVar309;
    fVar310 = fStack_6b4 * auVar90._12_4_ * 3.0;
    auVar25._12_4_ = fVar310;
    fVar313 = local_6c0 * auVar90._16_4_ * 3.0;
    auVar25._16_4_ = fVar313;
    fVar314 = fStack_6bc * auVar90._20_4_ * 3.0;
    auVar25._20_4_ = fVar314;
    fVar315 = fStack_6b8 * auVar90._24_4_ * 3.0;
    auVar25._24_4_ = fVar315;
    auVar25._28_4_ = auVar189._28_4_;
    auVar14 = vsubps_avx(local_440,auVar24);
    auVar90 = vperm2f128_avx(auVar14,auVar14,1);
    auVar90 = vshufps_avx(auVar90,auVar14,0x30);
    auVar90 = vshufps_avx(auVar14,auVar90,0x29);
    auVar17 = vsubps_avx(local_1c0,auVar25);
    auVar14 = vperm2f128_avx(auVar17,auVar17,1);
    auVar14 = vshufps_avx(auVar14,auVar17,0x30);
    auVar18 = vshufps_avx(auVar17,auVar14,0x29);
    fVar337 = auVar158._0_4_;
    fVar343 = auVar158._4_4_;
    fVar345 = auVar158._8_4_;
    fVar220 = auVar88._0_4_;
    fVar147 = auVar88._4_4_;
    fVar174 = auVar88._8_4_;
    fVar196 = auVar88._12_4_;
    fVar335 = auVar110._12_4_;
    auVar206 = vshufps_avx(auVar180,auVar180,0xaa);
    fVar221 = auVar206._0_4_;
    fVar171 = auVar206._4_4_;
    fVar193 = auVar206._8_4_;
    fVar197 = auVar206._12_4_;
    fVar346 = auVar283._0_4_ * fVar221 + fVar337 * fVar219;
    fVar316 = auVar283._4_4_ * fVar171 + fVar343 * fVar223;
    fVar318 = auVar283._8_4_ * fVar193 + fVar345 * fVar173;
    fVar320 = auVar283._12_4_ * fVar197 + auVar158._12_4_ * fVar195;
    fVar317 = auVar283._16_4_ * fVar221 + fVar337 * fVar295;
    fVar319 = auVar283._20_4_ * fVar171 + fVar343 * fVar296;
    fVar321 = auVar283._24_4_ * fVar193 + fVar345 * fVar297;
    fVar322 = fVar335 + fVar334 + fVar322;
    auVar206 = vshufps_avx(auVar180,auVar180,0xff);
    fVar222 = auVar206._0_4_;
    fVar172 = auVar206._4_4_;
    fVar194 = auVar206._8_4_;
    fVar294 = auVar206._12_4_;
    fVar323 = auVar283._0_4_ * fVar222 + fVar219 * fVar220;
    fVar331 = auVar283._4_4_ * fVar172 + fVar223 * fVar147;
    fVar332 = auVar283._8_4_ * fVar194 + fVar173 * fVar174;
    fVar333 = auVar283._12_4_ * fVar294 + fVar195 * fVar196;
    fVar336 = auVar283._16_4_ * fVar222 + fVar295 * fVar220;
    fVar342 = auVar283._20_4_ * fVar172 + fVar296 * fVar147;
    fVar344 = auVar283._24_4_ * fVar194 + fVar297 * fVar174;
    auVar206 = vshufps_avx(auVar150,auVar150,0xaa);
    auVar159 = vshufps_avx(auVar150,auVar150,0xff);
    fVar334 = auVar159._12_4_;
    auVar97._0_4_ =
         auVar283._0_4_ * fVar346 + fVar219 * (fVar337 * auVar283._0_4_ + auVar215._0_4_ * fVar219);
    auVar97._4_4_ =
         auVar283._4_4_ * fVar316 + fVar223 * (fVar343 * auVar283._4_4_ + auVar215._4_4_ * fVar223);
    auVar97._8_4_ =
         auVar283._8_4_ * fVar318 + fVar173 * (fVar345 * auVar283._8_4_ + auVar215._8_4_ * fVar173);
    auVar97._12_4_ =
         auVar283._12_4_ * fVar320 +
         fVar195 * (auVar158._12_4_ * auVar283._12_4_ + auVar215._12_4_ * fVar195);
    auVar97._16_4_ =
         auVar283._16_4_ * fVar317 +
         fVar295 * (fVar337 * auVar283._16_4_ + auVar215._0_4_ * fVar295);
    auVar97._20_4_ =
         auVar283._20_4_ * fVar319 +
         fVar296 * (fVar343 * auVar283._20_4_ + auVar215._4_4_ * fVar296);
    auVar97._24_4_ =
         auVar283._24_4_ * fVar321 +
         fVar297 * (fVar345 * auVar283._24_4_ + auVar215._8_4_ * fVar297);
    auVar97._28_4_ = fVar334 + auVar17._28_4_ + auVar14._28_4_;
    auVar330._0_4_ =
         auVar283._0_4_ * fVar323 + fVar219 * (auVar283._0_4_ * fVar220 + auVar110._0_4_ * fVar219);
    auVar330._4_4_ =
         auVar283._4_4_ * fVar331 + fVar223 * (auVar283._4_4_ * fVar147 + auVar110._4_4_ * fVar223);
    auVar330._8_4_ =
         auVar283._8_4_ * fVar332 + fVar173 * (auVar283._8_4_ * fVar174 + auVar110._8_4_ * fVar173);
    auVar330._12_4_ =
         auVar283._12_4_ * fVar333 + fVar195 * (auVar283._12_4_ * fVar196 + fVar335 * fVar195);
    auVar330._16_4_ =
         auVar283._16_4_ * fVar336 +
         fVar295 * (auVar283._16_4_ * fVar220 + auVar110._0_4_ * fVar295);
    auVar330._20_4_ =
         auVar283._20_4_ * fVar342 +
         fVar296 * (auVar283._20_4_ * fVar147 + auVar110._4_4_ * fVar296);
    auVar330._24_4_ =
         auVar283._24_4_ * fVar344 +
         fVar297 * (auVar283._24_4_ * fVar174 + auVar110._8_4_ * fVar297);
    auVar330._28_4_ = fVar334 + auVar14._28_4_ + auVar189._28_4_;
    auVar14 = vperm2f128_avx(local_440,local_440,1);
    auVar14 = vshufps_avx(auVar14,local_440,0x30);
    auVar19 = vshufps_avx(local_440,auVar14,0x29);
    auVar190._0_4_ =
         fVar219 * fVar346 + auVar283._0_4_ * (auVar206._0_4_ * auVar283._0_4_ + fVar219 * fVar221);
    auVar190._4_4_ =
         fVar223 * fVar316 + auVar283._4_4_ * (auVar206._4_4_ * auVar283._4_4_ + fVar223 * fVar171);
    auVar190._8_4_ =
         fVar173 * fVar318 + auVar283._8_4_ * (auVar206._8_4_ * auVar283._8_4_ + fVar173 * fVar193);
    auVar190._12_4_ =
         fVar195 * fVar320 +
         auVar283._12_4_ * (auVar206._12_4_ * auVar283._12_4_ + fVar195 * fVar197);
    auVar190._16_4_ =
         fVar295 * fVar317 +
         auVar283._16_4_ * (auVar206._0_4_ * auVar283._16_4_ + fVar295 * fVar221);
    auVar190._20_4_ =
         fVar296 * fVar319 +
         auVar283._20_4_ * (auVar206._4_4_ * auVar283._20_4_ + fVar296 * fVar171);
    auVar190._24_4_ =
         fVar297 * fVar321 +
         auVar283._24_4_ * (auVar206._8_4_ * auVar283._24_4_ + fVar297 * fVar193);
    auVar190._28_4_ = fVar322 + auVar206._12_4_ + fVar197;
    auVar237._0_4_ =
         fVar219 * fVar323 + auVar283._0_4_ * (auVar159._0_4_ * auVar283._0_4_ + fVar219 * fVar222);
    auVar237._4_4_ =
         fVar223 * fVar331 + auVar283._4_4_ * (auVar159._4_4_ * auVar283._4_4_ + fVar223 * fVar172);
    auVar237._8_4_ =
         fVar173 * fVar332 + auVar283._8_4_ * (auVar159._8_4_ * auVar283._8_4_ + fVar173 * fVar194);
    auVar237._12_4_ =
         fVar195 * fVar333 + auVar283._12_4_ * (fVar334 * auVar283._12_4_ + fVar195 * fVar294);
    auVar237._16_4_ =
         fVar295 * fVar336 +
         auVar283._16_4_ * (auVar159._0_4_ * auVar283._16_4_ + fVar295 * fVar222);
    auVar237._20_4_ =
         fVar296 * fVar342 +
         auVar283._20_4_ * (auVar159._4_4_ * auVar283._20_4_ + fVar296 * fVar172);
    auVar237._24_4_ =
         fVar297 * fVar344 +
         auVar283._24_4_ * (auVar159._8_4_ * auVar283._24_4_ + fVar297 * fVar194);
    auVar237._28_4_ = fVar335 + fVar196 + fVar334 + fVar294;
    auVar249._0_4_ = fVar219 * auVar97._0_4_ + auVar283._0_4_ * auVar190._0_4_;
    auVar249._4_4_ = fVar223 * auVar97._4_4_ + auVar283._4_4_ * auVar190._4_4_;
    auVar249._8_4_ = fVar173 * auVar97._8_4_ + auVar283._8_4_ * auVar190._8_4_;
    auVar249._12_4_ = fVar195 * auVar97._12_4_ + auVar283._12_4_ * auVar190._12_4_;
    auVar249._16_4_ = fVar295 * auVar97._16_4_ + auVar283._16_4_ * auVar190._16_4_;
    auVar249._20_4_ = fVar296 * auVar97._20_4_ + auVar283._20_4_ * auVar190._20_4_;
    auVar249._24_4_ = fVar297 * auVar97._24_4_ + auVar283._24_4_ * auVar190._24_4_;
    auVar249._28_4_ = fVar322 + fVar334 + fVar294;
    auVar267._0_4_ = fVar219 * auVar330._0_4_ + auVar283._0_4_ * auVar237._0_4_;
    auVar267._4_4_ = fVar223 * auVar330._4_4_ + auVar283._4_4_ * auVar237._4_4_;
    auVar267._8_4_ = fVar173 * auVar330._8_4_ + auVar283._8_4_ * auVar237._8_4_;
    auVar267._12_4_ = fVar195 * auVar330._12_4_ + auVar283._12_4_ * auVar237._12_4_;
    auVar267._16_4_ = fVar295 * auVar330._16_4_ + auVar283._16_4_ * auVar237._16_4_;
    auVar267._20_4_ = fVar296 * auVar330._20_4_ + auVar283._20_4_ * auVar237._20_4_;
    auVar267._24_4_ = fVar297 * auVar330._24_4_ + auVar283._24_4_ * auVar237._24_4_;
    auVar267._28_4_ = auVar15._28_4_ + auVar283._28_4_;
    auVar14 = vsubps_avx(auVar190,auVar97);
    auVar15 = vsubps_avx(auVar237,auVar330);
    local_220 = local_6c0 * auVar14._0_4_ * 3.0;
    fStack_21c = fStack_6bc * auVar14._4_4_ * 3.0;
    auVar26._4_4_ = fStack_21c;
    auVar26._0_4_ = local_220;
    fStack_218 = fStack_6b8 * auVar14._8_4_ * 3.0;
    auVar26._8_4_ = fStack_218;
    fStack_214 = fStack_6b4 * auVar14._12_4_ * 3.0;
    auVar26._12_4_ = fStack_214;
    fStack_210 = local_6c0 * auVar14._16_4_ * 3.0;
    auVar26._16_4_ = fStack_210;
    fStack_20c = fStack_6bc * auVar14._20_4_ * 3.0;
    auVar26._20_4_ = fStack_20c;
    fStack_208 = fStack_6b8 * auVar14._24_4_ * 3.0;
    auVar26._24_4_ = fStack_208;
    auVar26._28_4_ = auVar237._28_4_;
    local_240 = local_6c0 * auVar15._0_4_ * 3.0;
    fStack_23c = fStack_6bc * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fStack_23c;
    auVar27._0_4_ = local_240;
    fStack_238 = fStack_6b8 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fStack_238;
    fStack_234 = fStack_6b4 * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fStack_234;
    local_6c0 = local_6c0 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = local_6c0;
    fStack_6bc = fStack_6bc * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fStack_6bc;
    fStack_6b8 = fStack_6b8 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fStack_6b8;
    auVar27._28_4_ = fStack_6b4;
    auVar14 = vperm2f128_avx(auVar249,auVar249,1);
    auVar14 = vshufps_avx(auVar14,auVar249,0x30);
    auVar20 = vshufps_avx(auVar249,auVar14,0x29);
    auVar15 = vsubps_avx(auVar249,auVar26);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar21 = vshufps_avx(auVar15,auVar14,0x29);
    auVar15 = vsubps_avx(auVar267,auVar27);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar22 = vshufps_avx(auVar15,auVar14,0x29);
    auVar17 = vsubps_avx(auVar249,local_440);
    auVar91 = vsubps_avx(auVar20,auVar19);
    fVar219 = auVar91._0_4_ + auVar17._0_4_;
    fVar220 = auVar91._4_4_ + auVar17._4_4_;
    fVar221 = auVar91._8_4_ + auVar17._8_4_;
    fVar222 = auVar91._12_4_ + auVar17._12_4_;
    fVar223 = auVar91._16_4_ + auVar17._16_4_;
    fVar147 = auVar91._20_4_ + auVar17._20_4_;
    fVar171 = auVar91._24_4_ + auVar17._24_4_;
    auVar15 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar15 = vshufps_avx(auVar15,local_1c0,0x30);
    local_1e0 = vshufps_avx(local_1c0,auVar15,0x29);
    auVar15 = vperm2f128_avx(auVar267,auVar267,1);
    auVar15 = vshufps_avx(auVar15,auVar267,0x30);
    auVar23 = vshufps_avx(auVar267,auVar15,0x29);
    auVar15 = vsubps_avx(auVar267,local_1c0);
    auVar92 = vsubps_avx(auVar23,local_1e0);
    fVar172 = auVar15._0_4_ + auVar92._0_4_;
    fVar173 = auVar15._4_4_ + auVar92._4_4_;
    fVar174 = auVar15._8_4_ + auVar92._8_4_;
    fVar193 = auVar15._12_4_ + auVar92._12_4_;
    fVar194 = auVar15._16_4_ + auVar92._16_4_;
    fVar195 = auVar15._20_4_ + auVar92._20_4_;
    fVar196 = auVar15._24_4_ + auVar92._24_4_;
    fVar197 = auVar15._28_4_;
    auVar28._4_4_ = local_1c0._4_4_ * fVar220;
    auVar28._0_4_ = local_1c0._0_4_ * fVar219;
    auVar28._8_4_ = local_1c0._8_4_ * fVar221;
    auVar28._12_4_ = local_1c0._12_4_ * fVar222;
    auVar28._16_4_ = local_1c0._16_4_ * fVar223;
    auVar28._20_4_ = local_1c0._20_4_ * fVar147;
    auVar28._24_4_ = local_1c0._24_4_ * fVar171;
    auVar28._28_4_ = fVar197;
    auVar29._4_4_ = fVar173 * local_440._4_4_;
    auVar29._0_4_ = fVar172 * local_440._0_4_;
    auVar29._8_4_ = fVar174 * local_440._8_4_;
    auVar29._12_4_ = fVar193 * local_440._12_4_;
    auVar29._16_4_ = fVar194 * local_440._16_4_;
    auVar29._20_4_ = fVar195 * local_440._20_4_;
    auVar29._24_4_ = fVar196 * local_440._24_4_;
    auVar29._28_4_ = auVar14._28_4_;
    auVar15 = vsubps_avx(auVar28,auVar29);
    local_200 = local_440._0_4_ + local_200;
    fStack_1fc = local_440._4_4_ + fStack_1fc;
    fStack_1f8 = local_440._8_4_ + fStack_1f8;
    fStack_1f4 = local_440._12_4_ + fStack_1f4;
    fStack_1f0 = local_440._16_4_ + fStack_1f0;
    fStack_1ec = local_440._20_4_ + fStack_1ec;
    fStack_1e8 = local_440._24_4_ + fStack_1e8;
    fStack_1e4 = local_440._28_4_ + auVar16._28_4_;
    fVar307 = local_1c0._0_4_ + fVar307;
    fVar308 = local_1c0._4_4_ + fVar308;
    fVar309 = local_1c0._8_4_ + fVar309;
    fVar310 = local_1c0._12_4_ + fVar310;
    fVar313 = local_1c0._16_4_ + fVar313;
    fVar314 = local_1c0._20_4_ + fVar314;
    fVar315 = local_1c0._24_4_ + fVar315;
    auVar30._4_4_ = fVar308 * fVar220;
    auVar30._0_4_ = fVar307 * fVar219;
    auVar30._8_4_ = fVar309 * fVar221;
    auVar30._12_4_ = fVar310 * fVar222;
    auVar30._16_4_ = fVar313 * fVar223;
    auVar30._20_4_ = fVar314 * fVar147;
    auVar30._24_4_ = fVar315 * fVar171;
    auVar30._28_4_ = fVar197;
    auVar31._4_4_ = fVar173 * fStack_1fc;
    auVar31._0_4_ = fVar172 * local_200;
    auVar31._8_4_ = fVar174 * fStack_1f8;
    auVar31._12_4_ = fVar193 * fStack_1f4;
    auVar31._16_4_ = fVar194 * fStack_1f0;
    auVar31._20_4_ = fVar195 * fStack_1ec;
    auVar31._24_4_ = fVar196 * fStack_1e8;
    auVar31._28_4_ = fStack_1e4;
    auVar16 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar18._4_4_ * fVar220;
    auVar32._0_4_ = auVar18._0_4_ * fVar219;
    auVar32._8_4_ = auVar18._8_4_ * fVar221;
    auVar32._12_4_ = auVar18._12_4_ * fVar222;
    auVar32._16_4_ = auVar18._16_4_ * fVar223;
    auVar32._20_4_ = auVar18._20_4_ * fVar147;
    auVar32._24_4_ = auVar18._24_4_ * fVar171;
    auVar32._28_4_ = fVar197;
    local_6a0._0_4_ = auVar90._0_4_;
    local_6a0._4_4_ = auVar90._4_4_;
    fStack_698 = auVar90._8_4_;
    fStack_694 = auVar90._12_4_;
    fStack_690 = auVar90._16_4_;
    fStack_68c = auVar90._20_4_;
    fStack_688 = auVar90._24_4_;
    auVar33._4_4_ = fVar173 * (float)local_6a0._4_4_;
    auVar33._0_4_ = fVar172 * (float)local_6a0._0_4_;
    auVar33._8_4_ = fVar174 * fStack_698;
    auVar33._12_4_ = fVar193 * fStack_694;
    auVar33._16_4_ = fVar194 * fStack_690;
    auVar33._20_4_ = fVar195 * fStack_68c;
    auVar33._24_4_ = fVar196 * fStack_688;
    auVar33._28_4_ = 0x40400000;
    auVar93 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_1e0._4_4_ * fVar220;
    auVar34._0_4_ = local_1e0._0_4_ * fVar219;
    auVar34._8_4_ = local_1e0._8_4_ * fVar221;
    auVar34._12_4_ = local_1e0._12_4_ * fVar222;
    auVar34._16_4_ = local_1e0._16_4_ * fVar223;
    auVar34._20_4_ = local_1e0._20_4_ * fVar147;
    auVar34._24_4_ = local_1e0._24_4_ * fVar171;
    auVar34._28_4_ = fVar197;
    auVar35._4_4_ = auVar19._4_4_ * fVar173;
    auVar35._0_4_ = auVar19._0_4_ * fVar172;
    auVar35._8_4_ = auVar19._8_4_ * fVar174;
    auVar35._12_4_ = auVar19._12_4_ * fVar193;
    auVar35._16_4_ = auVar19._16_4_ * fVar194;
    auVar35._20_4_ = auVar19._20_4_ * fVar195;
    auVar35._24_4_ = auVar19._24_4_ * fVar196;
    auVar35._28_4_ = local_1e0._28_4_;
    auVar121 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar267._4_4_ * fVar220;
    auVar36._0_4_ = auVar267._0_4_ * fVar219;
    auVar36._8_4_ = auVar267._8_4_ * fVar221;
    auVar36._12_4_ = auVar267._12_4_ * fVar222;
    auVar36._16_4_ = auVar267._16_4_ * fVar223;
    auVar36._20_4_ = auVar267._20_4_ * fVar147;
    auVar36._24_4_ = auVar267._24_4_ * fVar171;
    auVar36._28_4_ = fVar197;
    auVar37._4_4_ = fVar173 * auVar249._4_4_;
    auVar37._0_4_ = fVar172 * auVar249._0_4_;
    auVar37._8_4_ = fVar174 * auVar249._8_4_;
    auVar37._12_4_ = fVar193 * auVar249._12_4_;
    auVar37._16_4_ = fVar194 * auVar249._16_4_;
    auVar37._20_4_ = fVar195 * auVar249._20_4_;
    auVar37._24_4_ = fVar196 * auVar249._24_4_;
    auVar37._28_4_ = auVar18._28_4_;
    auVar122 = vsubps_avx(auVar36,auVar37);
    local_220 = auVar249._0_4_ + local_220;
    fStack_21c = auVar249._4_4_ + fStack_21c;
    fStack_218 = auVar249._8_4_ + fStack_218;
    fStack_214 = auVar249._12_4_ + fStack_214;
    fStack_210 = auVar249._16_4_ + fStack_210;
    fStack_20c = auVar249._20_4_ + fStack_20c;
    fStack_208 = auVar249._24_4_ + fStack_208;
    fStack_204 = auVar249._28_4_ + auVar237._28_4_;
    local_240 = auVar267._0_4_ + local_240;
    fStack_23c = auVar267._4_4_ + fStack_23c;
    fStack_238 = auVar267._8_4_ + fStack_238;
    fStack_234 = auVar267._12_4_ + fStack_234;
    fStack_230 = auVar267._16_4_ + local_6c0;
    fStack_22c = auVar267._20_4_ + fStack_6bc;
    fStack_228 = auVar267._24_4_ + fStack_6b8;
    fStack_224 = auVar267._28_4_ + fStack_6b4;
    auVar38._4_4_ = fStack_23c * fVar220;
    auVar38._0_4_ = local_240 * fVar219;
    auVar38._8_4_ = fStack_238 * fVar221;
    auVar38._12_4_ = fStack_234 * fVar222;
    auVar38._16_4_ = fStack_230 * fVar223;
    auVar38._20_4_ = fStack_22c * fVar147;
    auVar38._24_4_ = fStack_228 * fVar171;
    auVar38._28_4_ = auVar267._28_4_ + fStack_6b4;
    auVar39._4_4_ = fStack_21c * fVar173;
    auVar39._0_4_ = local_220 * fVar172;
    auVar39._8_4_ = fStack_218 * fVar174;
    auVar39._12_4_ = fStack_214 * fVar193;
    auVar39._16_4_ = fStack_210 * fVar194;
    auVar39._20_4_ = fStack_20c * fVar195;
    auVar39._24_4_ = fStack_208 * fVar196;
    auVar39._28_4_ = fStack_204;
    auVar123 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar22._4_4_ * fVar220;
    auVar40._0_4_ = auVar22._0_4_ * fVar219;
    auVar40._8_4_ = auVar22._8_4_ * fVar221;
    auVar40._12_4_ = auVar22._12_4_ * fVar222;
    auVar40._16_4_ = auVar22._16_4_ * fVar223;
    auVar40._20_4_ = auVar22._20_4_ * fVar147;
    auVar40._24_4_ = auVar22._24_4_ * fVar171;
    auVar40._28_4_ = fStack_204;
    auVar41._4_4_ = fVar173 * auVar21._4_4_;
    auVar41._0_4_ = fVar172 * auVar21._0_4_;
    auVar41._8_4_ = fVar174 * auVar21._8_4_;
    auVar41._12_4_ = fVar193 * auVar21._12_4_;
    auVar41._16_4_ = fVar194 * auVar21._16_4_;
    auVar41._20_4_ = fVar195 * auVar21._20_4_;
    auVar41._24_4_ = fVar196 * auVar21._24_4_;
    auVar41._28_4_ = auVar21._28_4_;
    auVar140 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar23._4_4_ * fVar220;
    auVar42._0_4_ = auVar23._0_4_ * fVar219;
    auVar42._8_4_ = auVar23._8_4_ * fVar221;
    auVar42._12_4_ = auVar23._12_4_ * fVar222;
    auVar42._16_4_ = auVar23._16_4_ * fVar223;
    auVar42._20_4_ = auVar23._20_4_ * fVar147;
    auVar42._24_4_ = auVar23._24_4_ * fVar171;
    auVar42._28_4_ = auVar91._28_4_ + auVar17._28_4_;
    auVar43._4_4_ = auVar20._4_4_ * fVar173;
    auVar43._0_4_ = auVar20._0_4_ * fVar172;
    auVar43._8_4_ = auVar20._8_4_ * fVar174;
    auVar43._12_4_ = auVar20._12_4_ * fVar193;
    auVar43._16_4_ = auVar20._16_4_ * fVar194;
    auVar43._20_4_ = auVar20._20_4_ * fVar195;
    auVar43._24_4_ = auVar20._24_4_ * fVar196;
    auVar43._28_4_ = fVar197 + auVar92._28_4_;
    auVar91 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar15,auVar16);
    auVar90 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar93,auVar121);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar93,auVar121);
    auVar90 = vmaxps_avx(auVar90,auVar14);
    auVar16 = vminps_avx(auVar122,auVar123);
    auVar14 = vmaxps_avx(auVar122,auVar123);
    auVar17 = vminps_avx(auVar140,auVar91);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar140,auVar91);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar90,auVar14);
    auVar90 = vcmpps_avx(auVar16,local_260,2);
    auVar14 = vcmpps_avx(auVar14,local_280,5);
    auVar90 = vandps_avx(auVar14,auVar90);
    auVar14 = local_320 & auVar90;
    uVar76 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(auVar19,local_440);
      auVar15 = vsubps_avx(auVar20,auVar249);
      fVar220 = auVar14._0_4_ + auVar15._0_4_;
      fVar221 = auVar14._4_4_ + auVar15._4_4_;
      fVar222 = auVar14._8_4_ + auVar15._8_4_;
      fVar223 = auVar14._12_4_ + auVar15._12_4_;
      fVar147 = auVar14._16_4_ + auVar15._16_4_;
      fVar171 = auVar14._20_4_ + auVar15._20_4_;
      fVar172 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(local_1e0,local_1c0);
      auVar17 = vsubps_avx(auVar23,auVar267);
      fVar173 = auVar16._0_4_ + auVar17._0_4_;
      fVar174 = auVar16._4_4_ + auVar17._4_4_;
      fVar193 = auVar16._8_4_ + auVar17._8_4_;
      fVar194 = auVar16._12_4_ + auVar17._12_4_;
      fVar195 = auVar16._16_4_ + auVar17._16_4_;
      fVar196 = auVar16._20_4_ + auVar17._20_4_;
      fVar197 = auVar16._24_4_ + auVar17._24_4_;
      fVar219 = auVar17._28_4_;
      auVar44._4_4_ = local_1c0._4_4_ * fVar221;
      auVar44._0_4_ = local_1c0._0_4_ * fVar220;
      auVar44._8_4_ = local_1c0._8_4_ * fVar222;
      auVar44._12_4_ = local_1c0._12_4_ * fVar223;
      auVar44._16_4_ = local_1c0._16_4_ * fVar147;
      auVar44._20_4_ = local_1c0._20_4_ * fVar171;
      auVar44._24_4_ = local_1c0._24_4_ * fVar172;
      auVar44._28_4_ = local_1c0._28_4_;
      auVar45._4_4_ = local_440._4_4_ * fVar174;
      auVar45._0_4_ = local_440._0_4_ * fVar173;
      auVar45._8_4_ = local_440._8_4_ * fVar193;
      auVar45._12_4_ = local_440._12_4_ * fVar194;
      auVar45._16_4_ = local_440._16_4_ * fVar195;
      auVar45._20_4_ = local_440._20_4_ * fVar196;
      auVar45._24_4_ = local_440._24_4_ * fVar197;
      auVar45._28_4_ = local_440._28_4_;
      auVar17 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar308 * fVar221;
      auVar46._0_4_ = fVar307 * fVar220;
      auVar46._8_4_ = fVar309 * fVar222;
      auVar46._12_4_ = fVar310 * fVar223;
      auVar46._16_4_ = fVar313 * fVar147;
      auVar46._20_4_ = fVar314 * fVar171;
      auVar46._24_4_ = fVar315 * fVar172;
      auVar46._28_4_ = local_1c0._28_4_;
      auVar47._4_4_ = fVar174 * fStack_1fc;
      auVar47._0_4_ = fVar173 * local_200;
      auVar47._8_4_ = fVar193 * fStack_1f8;
      auVar47._12_4_ = fVar194 * fStack_1f4;
      auVar47._16_4_ = fVar195 * fStack_1f0;
      auVar47._20_4_ = fVar196 * fStack_1ec;
      auVar47._24_4_ = fVar197 * fStack_1e8;
      auVar47._28_4_ = fVar219;
      auVar91 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar221 * auVar18._4_4_;
      auVar48._0_4_ = fVar220 * auVar18._0_4_;
      auVar48._8_4_ = fVar222 * auVar18._8_4_;
      auVar48._12_4_ = fVar223 * auVar18._12_4_;
      auVar48._16_4_ = fVar147 * auVar18._16_4_;
      auVar48._20_4_ = fVar171 * auVar18._20_4_;
      auVar48._24_4_ = fVar172 * auVar18._24_4_;
      auVar48._28_4_ = fVar219;
      auVar49._4_4_ = fVar174 * (float)local_6a0._4_4_;
      auVar49._0_4_ = fVar173 * (float)local_6a0._0_4_;
      auVar49._8_4_ = fVar193 * fStack_698;
      auVar49._12_4_ = fVar194 * fStack_694;
      auVar49._16_4_ = fVar195 * fStack_690;
      auVar49._20_4_ = fVar196 * fStack_68c;
      auVar49._24_4_ = fVar197 * fStack_688;
      auVar49._28_4_ = local_1c0._28_4_ + auVar189._28_4_;
      auVar18 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_1e0._4_4_ * fVar221;
      auVar50._0_4_ = local_1e0._0_4_ * fVar220;
      auVar50._8_4_ = local_1e0._8_4_ * fVar222;
      auVar50._12_4_ = local_1e0._12_4_ * fVar223;
      auVar50._16_4_ = local_1e0._16_4_ * fVar147;
      auVar50._20_4_ = local_1e0._20_4_ * fVar171;
      auVar50._24_4_ = local_1e0._24_4_ * fVar172;
      auVar50._28_4_ = local_1c0._28_4_ + auVar189._28_4_;
      auVar51._4_4_ = auVar19._4_4_ * fVar174;
      auVar51._0_4_ = auVar19._0_4_ * fVar173;
      auVar51._8_4_ = auVar19._8_4_ * fVar193;
      auVar51._12_4_ = auVar19._12_4_ * fVar194;
      auVar51._16_4_ = auVar19._16_4_ * fVar195;
      auVar51._20_4_ = auVar19._20_4_ * fVar196;
      uVar4 = auVar19._28_4_;
      auVar51._24_4_ = auVar19._24_4_ * fVar197;
      auVar51._28_4_ = uVar4;
      auVar19 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar267._4_4_ * fVar221;
      auVar52._0_4_ = auVar267._0_4_ * fVar220;
      auVar52._8_4_ = auVar267._8_4_ * fVar222;
      auVar52._12_4_ = auVar267._12_4_ * fVar223;
      auVar52._16_4_ = auVar267._16_4_ * fVar147;
      auVar52._20_4_ = auVar267._20_4_ * fVar171;
      auVar52._24_4_ = auVar267._24_4_ * fVar172;
      auVar52._28_4_ = auVar267._28_4_;
      auVar53._4_4_ = auVar249._4_4_ * fVar174;
      auVar53._0_4_ = auVar249._0_4_ * fVar173;
      auVar53._8_4_ = auVar249._8_4_ * fVar193;
      auVar53._12_4_ = auVar249._12_4_ * fVar194;
      auVar53._16_4_ = auVar249._16_4_ * fVar195;
      auVar53._20_4_ = auVar249._20_4_ * fVar196;
      auVar53._24_4_ = auVar249._24_4_ * fVar197;
      auVar53._28_4_ = auVar249._28_4_;
      auVar92 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar221 * fStack_23c;
      auVar54._0_4_ = fVar220 * local_240;
      auVar54._8_4_ = fVar222 * fStack_238;
      auVar54._12_4_ = fVar223 * fStack_234;
      auVar54._16_4_ = fVar147 * fStack_230;
      auVar54._20_4_ = fVar171 * fStack_22c;
      auVar54._24_4_ = fVar172 * fStack_228;
      auVar54._28_4_ = auVar267._28_4_;
      auVar55._4_4_ = fVar174 * fStack_21c;
      auVar55._0_4_ = fVar173 * local_220;
      auVar55._8_4_ = fVar193 * fStack_218;
      auVar55._12_4_ = fVar194 * fStack_214;
      auVar55._16_4_ = fVar195 * fStack_210;
      auVar55._20_4_ = fVar196 * fStack_20c;
      auVar55._24_4_ = fVar197 * fStack_208;
      auVar55._28_4_ = uVar4;
      auVar93 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar221 * auVar22._4_4_;
      auVar56._0_4_ = fVar220 * auVar22._0_4_;
      auVar56._8_4_ = fVar222 * auVar22._8_4_;
      auVar56._12_4_ = fVar223 * auVar22._12_4_;
      auVar56._16_4_ = fVar147 * auVar22._16_4_;
      auVar56._20_4_ = fVar171 * auVar22._20_4_;
      auVar56._24_4_ = fVar172 * auVar22._24_4_;
      auVar56._28_4_ = uVar4;
      auVar57._4_4_ = fVar174 * auVar21._4_4_;
      auVar57._0_4_ = fVar173 * auVar21._0_4_;
      auVar57._8_4_ = fVar193 * auVar21._8_4_;
      auVar57._12_4_ = fVar194 * auVar21._12_4_;
      auVar57._16_4_ = fVar195 * auVar21._16_4_;
      auVar57._20_4_ = fVar196 * auVar21._20_4_;
      auVar57._24_4_ = fVar197 * auVar21._24_4_;
      auVar57._28_4_ = local_1e0._28_4_;
      auVar21 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar23._4_4_ * fVar221;
      auVar58._0_4_ = auVar23._0_4_ * fVar220;
      auVar58._8_4_ = auVar23._8_4_ * fVar222;
      auVar58._12_4_ = auVar23._12_4_ * fVar223;
      auVar58._16_4_ = auVar23._16_4_ * fVar147;
      auVar58._20_4_ = auVar23._20_4_ * fVar171;
      auVar58._24_4_ = auVar23._24_4_ * fVar172;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar20._4_4_ * fVar174;
      auVar59._0_4_ = auVar20._0_4_ * fVar173;
      auVar59._8_4_ = auVar20._8_4_ * fVar193;
      auVar59._12_4_ = auVar20._12_4_ * fVar194;
      auVar59._16_4_ = auVar20._16_4_ * fVar195;
      auVar59._20_4_ = auVar20._20_4_ * fVar196;
      auVar59._24_4_ = auVar20._24_4_ * fVar197;
      auVar59._28_4_ = auVar16._28_4_ + fVar219;
      auVar20 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar17,auVar91);
      auVar14 = vmaxps_avx(auVar17,auVar91);
      auVar16 = vminps_avx(auVar18,auVar19);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar18,auVar19);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar92,auVar93);
      auVar15 = vmaxps_avx(auVar92,auVar93);
      auVar18 = vminps_avx(auVar21,auVar20);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar20);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_260,2);
      auVar15 = vcmpps_avx(auVar15,local_280,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar90 = vandps_avx(auVar90,local_320);
      auVar15 = auVar90 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar14,auVar90);
        uVar76 = vmovmskps_avx(auVar90);
      }
    }
    if (uVar76 != 0) {
      auStack_480[uVar80] = uVar76;
      uVar5 = vmovlps_avx(auVar111);
      *(undefined8 *)(afStack_300 + uVar80 * 2) = uVar5;
      uVar6 = vmovlps_avx(_local_6e0);
      auStack_1a0[uVar80] = uVar6;
      uVar80 = (ulong)((int)uVar80 + 1);
    }
    auVar341 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar80 == 0) {
        if (bVar74) {
          return local_721;
        }
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar100._4_4_ = uVar4;
        auVar100._0_4_ = uVar4;
        auVar100._8_4_ = uVar4;
        auVar100._12_4_ = uVar4;
        auVar100._16_4_ = uVar4;
        auVar100._20_4_ = uVar4;
        auVar100._24_4_ = uVar4;
        auVar100._28_4_ = uVar4;
        auVar90 = vcmpps_avx(local_2a0,auVar100,2);
        uVar82 = vmovmskps_avx(auVar90);
        uVar75 = uVar75 & local_548 & uVar82;
        local_721 = uVar75 != 0;
        if (!local_721) {
          return local_721;
        }
        goto LAB_01142949;
      }
      uVar79 = (int)uVar80 - 1;
      uVar81 = (ulong)uVar79;
      uVar76 = auStack_480[uVar81];
      fVar219 = afStack_300[uVar81 * 2];
      fVar220 = afStack_300[uVar81 * 2 + 1];
      register0x00001548 = 0;
      local_6e0 = (undefined1  [8])auStack_1a0[uVar81];
      uVar6 = 0;
      if (uVar76 != 0) {
        for (; (uVar76 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar76 = uVar76 - 1 & uVar76;
      auStack_480[uVar81] = uVar76;
      if (uVar76 == 0) {
        uVar80 = (ulong)uVar79;
      }
      fVar222 = (float)(uVar6 + 1) * 0.14285715;
      fVar221 = (1.0 - (float)uVar6 * 0.14285715) * fVar219 + fVar220 * (float)uVar6 * 0.14285715;
      fVar219 = (1.0 - fVar222) * fVar219 + fVar220 * fVar222;
      fVar220 = fVar219 - fVar221;
      if (0.16666667 <= fVar220) break;
      auVar111 = vshufps_avx(_local_6e0,_local_6e0,0x50);
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = &DAT_3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar206 = vsubps_avx(auVar132,auVar111);
      fVar222 = auVar111._0_4_;
      fVar147 = auVar111._4_4_;
      fVar172 = auVar111._8_4_;
      fVar174 = auVar111._12_4_;
      fVar223 = auVar206._0_4_;
      fVar171 = auVar206._4_4_;
      fVar173 = auVar206._8_4_;
      fVar193 = auVar206._12_4_;
      auVar151._0_4_ = auVar286._0_4_ * fVar222 + fVar175 * fVar223;
      auVar151._4_4_ = auVar286._4_4_ * fVar147 + fVar177 * fVar171;
      auVar151._8_4_ = auVar286._0_4_ * fVar172 + fVar175 * fVar173;
      auVar151._12_4_ = auVar286._4_4_ * fVar174 + fVar177 * fVar193;
      auVar181._0_4_ = auVar255._0_4_ * fVar222 + fVar176 * fVar223;
      auVar181._4_4_ = auVar255._4_4_ * fVar147 + fVar192 * fVar171;
      auVar181._8_4_ = auVar255._0_4_ * fVar172 + fVar176 * fVar173;
      auVar181._12_4_ = auVar255._4_4_ * fVar174 + fVar192 * fVar193;
      auVar207._0_4_ = auVar105._0_4_ * fVar222 + fVar223 * auVar338._0_4_;
      auVar207._4_4_ = auVar105._4_4_ * fVar147 + fVar171 * auVar338._4_4_;
      auVar207._8_4_ = auVar105._0_4_ * fVar172 + fVar173 * auVar338._0_4_;
      auVar207._12_4_ = auVar105._4_4_ * fVar174 + fVar193 * auVar338._4_4_;
      auVar107._0_4_ = auVar86._0_4_ * fVar222 + auVar324._0_4_ * fVar223;
      auVar107._4_4_ = auVar86._4_4_ * fVar147 + auVar324._4_4_ * fVar171;
      auVar107._8_4_ = auVar86._0_4_ * fVar172 + auVar324._0_4_ * fVar173;
      auVar107._12_4_ = auVar86._4_4_ * fVar174 + auVar324._4_4_ * fVar193;
      auVar143._16_16_ = auVar151;
      auVar143._0_16_ = auVar151;
      auVar168._16_16_ = auVar181;
      auVar168._0_16_ = auVar181;
      auVar191._16_16_ = auVar207;
      auVar191._0_16_ = auVar207;
      auVar90 = vshufps_avx(ZEXT2032(CONCAT416(fVar219,ZEXT416((uint)fVar221))),
                            ZEXT2032(CONCAT416(fVar219,ZEXT416((uint)fVar221))),0);
      auVar14 = vsubps_avx(auVar168,auVar143);
      fVar222 = auVar90._0_4_;
      fVar223 = auVar90._4_4_;
      fVar147 = auVar90._8_4_;
      fVar171 = auVar90._12_4_;
      fVar172 = auVar90._16_4_;
      fVar173 = auVar90._20_4_;
      fVar174 = auVar90._24_4_;
      auVar144._0_4_ = auVar151._0_4_ + auVar14._0_4_ * fVar222;
      auVar144._4_4_ = auVar151._4_4_ + auVar14._4_4_ * fVar223;
      auVar144._8_4_ = auVar151._8_4_ + auVar14._8_4_ * fVar147;
      auVar144._12_4_ = auVar151._12_4_ + auVar14._12_4_ * fVar171;
      auVar144._16_4_ = auVar151._0_4_ + auVar14._16_4_ * fVar172;
      auVar144._20_4_ = auVar151._4_4_ + auVar14._20_4_ * fVar173;
      auVar144._24_4_ = auVar151._8_4_ + auVar14._24_4_ * fVar174;
      auVar144._28_4_ = auVar151._12_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar191,auVar168);
      auVar169._0_4_ = auVar181._0_4_ + auVar14._0_4_ * fVar222;
      auVar169._4_4_ = auVar181._4_4_ + auVar14._4_4_ * fVar223;
      auVar169._8_4_ = auVar181._8_4_ + auVar14._8_4_ * fVar147;
      auVar169._12_4_ = auVar181._12_4_ + auVar14._12_4_ * fVar171;
      auVar169._16_4_ = auVar181._0_4_ + auVar14._16_4_ * fVar172;
      auVar169._20_4_ = auVar181._4_4_ + auVar14._20_4_ * fVar173;
      auVar169._24_4_ = auVar181._8_4_ + auVar14._24_4_ * fVar174;
      auVar169._28_4_ = auVar181._12_4_ + auVar14._28_4_;
      auVar111 = vsubps_avx(auVar107,auVar207);
      auVar124._0_4_ = auVar207._0_4_ + auVar111._0_4_ * fVar222;
      auVar124._4_4_ = auVar207._4_4_ + auVar111._4_4_ * fVar223;
      auVar124._8_4_ = auVar207._8_4_ + auVar111._8_4_ * fVar147;
      auVar124._12_4_ = auVar207._12_4_ + auVar111._12_4_ * fVar171;
      auVar124._16_4_ = auVar207._0_4_ + auVar111._0_4_ * fVar172;
      auVar124._20_4_ = auVar207._4_4_ + auVar111._4_4_ * fVar173;
      auVar124._24_4_ = auVar207._8_4_ + auVar111._8_4_ * fVar174;
      auVar124._28_4_ = auVar207._12_4_ + auVar111._12_4_;
      auVar14 = vsubps_avx(auVar169,auVar144);
      auVar145._0_4_ = auVar144._0_4_ + fVar222 * auVar14._0_4_;
      auVar145._4_4_ = auVar144._4_4_ + fVar223 * auVar14._4_4_;
      auVar145._8_4_ = auVar144._8_4_ + fVar147 * auVar14._8_4_;
      auVar145._12_4_ = auVar144._12_4_ + fVar171 * auVar14._12_4_;
      auVar145._16_4_ = auVar144._16_4_ + fVar172 * auVar14._16_4_;
      auVar145._20_4_ = auVar144._20_4_ + fVar173 * auVar14._20_4_;
      auVar145._24_4_ = auVar144._24_4_ + fVar174 * auVar14._24_4_;
      auVar145._28_4_ = auVar144._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar124,auVar169);
      auVar125._0_4_ = auVar169._0_4_ + fVar222 * auVar14._0_4_;
      auVar125._4_4_ = auVar169._4_4_ + fVar223 * auVar14._4_4_;
      auVar125._8_4_ = auVar169._8_4_ + fVar147 * auVar14._8_4_;
      auVar125._12_4_ = auVar169._12_4_ + fVar171 * auVar14._12_4_;
      auVar125._16_4_ = auVar169._16_4_ + fVar172 * auVar14._16_4_;
      auVar125._20_4_ = auVar169._20_4_ + fVar173 * auVar14._20_4_;
      auVar125._24_4_ = auVar169._24_4_ + fVar174 * auVar14._24_4_;
      auVar125._28_4_ = auVar169._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar125,auVar145);
      auVar152._0_4_ = auVar145._0_4_ + fVar222 * auVar14._0_4_;
      auVar152._4_4_ = auVar145._4_4_ + fVar223 * auVar14._4_4_;
      auVar152._8_4_ = auVar145._8_4_ + fVar147 * auVar14._8_4_;
      auVar152._12_4_ = auVar145._12_4_ + fVar171 * auVar14._12_4_;
      auVar170._16_4_ = auVar145._16_4_ + fVar172 * auVar14._16_4_;
      auVar170._0_16_ = auVar152;
      auVar170._20_4_ = auVar145._20_4_ + fVar173 * auVar14._20_4_;
      auVar170._24_4_ = auVar145._24_4_ + fVar174 * auVar14._24_4_;
      auVar170._28_4_ = auVar145._28_4_ + auVar169._28_4_;
      fVar222 = auVar14._4_4_ * 3.0;
      auVar133 = auVar170._16_16_;
      auVar110 = vshufps_avx(ZEXT416((uint)(fVar220 * 0.33333334)),
                             ZEXT416((uint)(fVar220 * 0.33333334)),0);
      auVar273._0_4_ = auVar152._0_4_ + auVar110._0_4_ * auVar14._0_4_ * 3.0;
      auVar273._4_4_ = auVar152._4_4_ + auVar110._4_4_ * fVar222;
      auVar273._8_4_ = auVar152._8_4_ + auVar110._8_4_ * auVar14._8_4_ * 3.0;
      auVar273._12_4_ = auVar152._12_4_ + auVar110._12_4_ * auVar14._12_4_ * 3.0;
      auVar215 = vshufpd_avx(auVar152,auVar152,3);
      auVar159 = vshufpd_avx(auVar133,auVar133,3);
      auVar111 = vsubps_avx(auVar215,auVar152);
      auVar206 = vsubps_avx(auVar159,auVar133);
      auVar108._0_4_ = auVar111._0_4_ + auVar206._0_4_;
      auVar108._4_4_ = auVar111._4_4_ + auVar206._4_4_;
      auVar108._8_4_ = auVar111._8_4_ + auVar206._8_4_;
      auVar108._12_4_ = auVar111._12_4_ + auVar206._12_4_;
      auVar111 = vmovshdup_avx(auVar152);
      auVar206 = vmovshdup_avx(auVar273);
      auVar158 = vshufps_avx(auVar108,auVar108,0);
      auVar88 = vshufps_avx(auVar108,auVar108,0x55);
      fVar173 = auVar88._0_4_;
      fVar174 = auVar88._4_4_;
      fVar193 = auVar88._8_4_;
      fVar194 = auVar88._12_4_;
      fVar223 = auVar158._0_4_;
      fVar147 = auVar158._4_4_;
      fVar171 = auVar158._8_4_;
      fVar172 = auVar158._12_4_;
      auVar256._0_4_ = fVar223 * auVar152._0_4_ + fVar173 * auVar111._0_4_;
      auVar256._4_4_ = fVar147 * auVar152._4_4_ + fVar174 * auVar111._4_4_;
      auVar256._8_4_ = fVar171 * auVar152._8_4_ + fVar193 * auVar111._8_4_;
      auVar256._12_4_ = fVar172 * auVar152._12_4_ + fVar194 * auVar111._12_4_;
      auVar274._0_4_ = auVar273._0_4_ * fVar223 + fVar173 * auVar206._0_4_;
      auVar274._4_4_ = auVar273._4_4_ * fVar147 + fVar174 * auVar206._4_4_;
      auVar274._8_4_ = auVar273._8_4_ * fVar171 + fVar193 * auVar206._8_4_;
      auVar274._12_4_ = auVar273._12_4_ * fVar172 + fVar194 * auVar206._12_4_;
      auVar206 = vshufps_avx(auVar256,auVar256,0xe8);
      auVar158 = vshufps_avx(auVar274,auVar274,0xe8);
      auVar111 = vcmpps_avx(auVar206,auVar158,1);
      uVar76 = vextractps_avx(auVar111,0);
      auVar88 = auVar274;
      if ((uVar76 & 1) == 0) {
        auVar88 = auVar256;
      }
      auVar109._0_4_ = auVar110._0_4_ * auVar14._16_4_ * 3.0;
      auVar109._4_4_ = auVar110._4_4_ * fVar222;
      auVar109._8_4_ = auVar110._8_4_ * auVar14._24_4_ * 3.0;
      auVar109._12_4_ = auVar110._12_4_ * auVar90._28_4_;
      auVar85 = vsubps_avx(auVar133,auVar109);
      auVar110 = vmovshdup_avx(auVar85);
      auVar133 = vmovshdup_avx(auVar133);
      fVar222 = auVar85._0_4_;
      fVar195 = auVar85._4_4_;
      auVar349._0_4_ = fVar223 * fVar222 + fVar173 * auVar110._0_4_;
      auVar349._4_4_ = fVar147 * fVar195 + fVar174 * auVar110._4_4_;
      auVar349._8_4_ = fVar171 * auVar85._8_4_ + fVar193 * auVar110._8_4_;
      auVar349._12_4_ = fVar172 * auVar85._12_4_ + fVar194 * auVar110._12_4_;
      auVar325._0_4_ = fVar223 * auVar170._16_4_ + fVar173 * auVar133._0_4_;
      auVar325._4_4_ = fVar147 * auVar170._20_4_ + fVar174 * auVar133._4_4_;
      auVar325._8_4_ = fVar171 * auVar170._24_4_ + fVar193 * auVar133._8_4_;
      auVar325._12_4_ = fVar172 * auVar170._28_4_ + fVar194 * auVar133._12_4_;
      auVar133 = vshufps_avx(auVar349,auVar349,0xe8);
      auVar271 = vshufps_avx(auVar325,auVar325,0xe8);
      auVar110 = vcmpps_avx(auVar133,auVar271,1);
      uVar76 = vextractps_avx(auVar110,0);
      auVar101 = auVar325;
      if ((uVar76 & 1) == 0) {
        auVar101 = auVar349;
      }
      auVar88 = vmaxss_avx(auVar101,auVar88);
      auVar206 = vminps_avx(auVar206,auVar158);
      auVar158 = vminps_avx(auVar133,auVar271);
      auVar158 = vminps_avx(auVar206,auVar158);
      auVar111 = vshufps_avx(auVar111,auVar111,0x55);
      auVar111 = vblendps_avx(auVar111,auVar110,2);
      auVar110 = vpslld_avx(auVar111,0x1f);
      auVar111 = vshufpd_avx(auVar274,auVar274,1);
      auVar111 = vinsertps_avx(auVar111,auVar325,0x9c);
      auVar206 = vshufpd_avx(auVar256,auVar256,1);
      auVar206 = vinsertps_avx(auVar206,auVar349,0x9c);
      auVar111 = vblendvps_avx(auVar206,auVar111,auVar110);
      auVar206 = vmovshdup_avx(auVar111);
      auVar111 = vmaxss_avx(auVar206,auVar111);
      fVar171 = auVar158._0_4_;
      auVar206 = vmovshdup_avx(auVar158);
      fVar147 = auVar111._0_4_;
      fVar172 = auVar206._0_4_;
      fVar223 = auVar88._0_4_;
      if ((0.0001 <= fVar171) || (fVar147 <= -0.0001)) {
        if ((-0.0001 < fVar223 && fVar172 < 0.0001) ||
           ((fVar171 < 0.0001 && -0.0001 < fVar223 || (fVar172 < 0.0001 && -0.0001 < fVar147))))
        goto LAB_01143b70;
LAB_011447ba:
        bVar60 = true;
        auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_01143b70:
        auVar341 = ZEXT864(0) << 0x20;
        auVar110 = vcmpps_avx(auVar158,ZEXT816(0) << 0x20,1);
        auVar206 = vcmpss_avx(auVar88,ZEXT416(0),1);
        auVar208._8_4_ = 0x3f800000;
        auVar208._0_8_ = &DAT_3f8000003f800000;
        auVar208._12_4_ = 0x3f800000;
        auVar275._8_4_ = 0xbf800000;
        auVar275._0_8_ = 0xbf800000bf800000;
        auVar275._12_4_ = 0xbf800000;
        auVar206 = vblendvps_avx(auVar208,auVar275,auVar206);
        auVar110 = vblendvps_avx(auVar208,auVar275,auVar110);
        auVar133 = vcmpss_avx(auVar206,auVar110,4);
        auVar133 = vpshufd_avx(ZEXT416(auVar133._0_4_ & 1),0x50);
        auVar133 = vpslld_avx(auVar133,0x1f);
        auVar133 = vpsrad_avx(auVar133,0x1f);
        auVar133 = vpandn_avx(auVar133,_DAT_02020eb0);
        auVar271 = vmovshdup_avx(auVar110);
        fVar173 = auVar271._0_4_;
        if ((auVar110._0_4_ != fVar173) || (NAN(auVar110._0_4_) || NAN(fVar173))) {
          if ((fVar172 != fVar171) || (NAN(fVar172) || NAN(fVar171))) {
            fVar171 = -fVar171 / (fVar172 - fVar171);
            auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar171) * 0.0 + fVar171)));
          }
          else {
            auVar110 = vcmpss_avx(auVar158,ZEXT416(0),0);
            auVar110 = vpshufd_avx(ZEXT416(auVar110._0_4_ & 1),0x50);
            auVar110 = vpslld_avx(auVar110,0x1f);
            auVar110 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar110);
          }
          auVar271 = vcmpps_avx(auVar133,auVar110,1);
          auVar158 = vblendps_avx(auVar133,auVar110,2);
          auVar110 = vblendps_avx(auVar110,auVar133,2);
          auVar133 = vblendvps_avx(auVar110,auVar158,auVar271);
        }
        auVar111 = vcmpss_avx(auVar111,ZEXT416(0),1);
        auVar134._8_4_ = 0x3f800000;
        auVar134._0_8_ = &DAT_3f8000003f800000;
        auVar134._12_4_ = 0x3f800000;
        auVar209._8_4_ = 0xbf800000;
        auVar209._0_8_ = 0xbf800000bf800000;
        auVar209._12_4_ = 0xbf800000;
        auVar111 = vblendvps_avx(auVar134,auVar209,auVar111);
        fVar171 = auVar111._0_4_;
        if ((auVar206._0_4_ != fVar171) || (NAN(auVar206._0_4_) || NAN(fVar171))) {
          if ((fVar147 != fVar223) || (NAN(fVar147) || NAN(fVar223))) {
            fVar223 = -fVar223 / (fVar147 - fVar223);
            auVar111 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar223) * 0.0 + fVar223)));
          }
          else {
            auVar111 = vcmpss_avx(auVar88,ZEXT416(0),0);
            auVar111 = vpshufd_avx(ZEXT416(auVar111._0_4_ & 1),0x50);
            auVar111 = vpslld_avx(auVar111,0x1f);
            auVar111 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar111);
          }
          auVar110 = vcmpps_avx(auVar133,auVar111,1);
          auVar206 = vblendps_avx(auVar133,auVar111,2);
          auVar111 = vblendps_avx(auVar111,auVar133,2);
          auVar133 = vblendvps_avx(auVar111,auVar206,auVar110);
        }
        if ((fVar173 != fVar171) || (NAN(fVar173) || NAN(fVar171))) {
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = &DAT_3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar111 = vcmpps_avx(auVar133,auVar112,1);
          auVar206 = vinsertps_avx(auVar133,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar210._4_12_ = auVar133._4_12_;
          auVar210._0_4_ = 0x3f800000;
          auVar133 = vblendvps_avx(auVar210,auVar206,auVar111);
        }
        auVar111 = vcmpps_avx(auVar133,_DAT_01fec6f0,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar133._4_12_;
        auVar206 = vinsertps_avx(auVar133,ZEXT416(0x3f800000),0x10);
        auVar111 = vblendvps_avx(auVar206,auVar62 << 0x20,auVar111);
        auVar206 = vmovshdup_avx(auVar111);
        bVar60 = true;
        if (auVar111._0_4_ <= auVar206._0_4_) {
          auVar113._0_4_ = auVar111._0_4_ + -0.1;
          auVar113._4_4_ = auVar111._4_4_ + 0.1;
          auVar113._8_4_ = auVar111._8_4_ + 0.0;
          auVar113._12_4_ = auVar111._12_4_ + 0.0;
          auVar110 = vshufpd_avx(auVar273,auVar273,3);
          auVar153._8_8_ = 0x3f80000000000000;
          auVar153._0_8_ = 0x3f80000000000000;
          auVar111 = vcmpps_avx(auVar113,auVar153,1);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar113._4_12_;
          auVar206 = vinsertps_avx(auVar113,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar111 = vblendvps_avx(auVar206,auVar63 << 0x20,auVar111);
          auVar206 = vshufpd_avx(auVar85,auVar85,3);
          auVar158 = vshufps_avx(auVar111,auVar111,0x50);
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = &DAT_3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar88 = vsubps_avx(auVar154,auVar158);
          local_660 = auVar215._0_4_;
          fStack_65c = auVar215._4_4_;
          fStack_658 = auVar215._8_4_;
          fStack_654 = auVar215._12_4_;
          fVar223 = auVar158._0_4_;
          fVar147 = auVar158._4_4_;
          fVar171 = auVar158._8_4_;
          fVar172 = auVar158._12_4_;
          local_640 = auVar159._0_4_;
          fStack_63c = auVar159._4_4_;
          fStack_638 = auVar159._8_4_;
          fStack_634 = auVar159._12_4_;
          fVar173 = auVar88._0_4_;
          fVar174 = auVar88._4_4_;
          fVar193 = auVar88._8_4_;
          fVar194 = auVar88._12_4_;
          auVar135._0_4_ = fVar223 * local_660 + fVar173 * auVar152._0_4_;
          auVar135._4_4_ = fVar147 * fStack_65c + fVar174 * auVar152._4_4_;
          auVar135._8_4_ = fVar171 * fStack_658 + fVar193 * auVar152._0_4_;
          auVar135._12_4_ = fVar172 * fStack_654 + fVar194 * auVar152._4_4_;
          auVar182._0_4_ = fVar223 * auVar110._0_4_ + fVar173 * auVar273._0_4_;
          auVar182._4_4_ = fVar147 * auVar110._4_4_ + fVar174 * auVar273._4_4_;
          auVar182._8_4_ = fVar171 * auVar110._8_4_ + fVar193 * auVar273._0_4_;
          auVar182._12_4_ = fVar172 * auVar110._12_4_ + fVar194 * auVar273._4_4_;
          auVar243._0_4_ = fVar223 * auVar206._0_4_ + fVar173 * fVar222;
          auVar243._4_4_ = fVar147 * auVar206._4_4_ + fVar174 * fVar195;
          auVar243._8_4_ = fVar171 * auVar206._8_4_ + fVar193 * fVar222;
          auVar243._12_4_ = fVar172 * auVar206._12_4_ + fVar194 * fVar195;
          auVar257._0_4_ = fVar223 * local_640 + fVar173 * auVar170._16_4_;
          auVar257._4_4_ = fVar147 * fStack_63c + fVar174 * auVar170._20_4_;
          auVar257._8_4_ = fVar171 * fStack_638 + fVar193 * auVar170._16_4_;
          auVar257._12_4_ = fVar172 * fStack_634 + fVar194 * auVar170._20_4_;
          auVar159 = vsubps_avx(auVar154,auVar111);
          auVar206 = vmovshdup_avx(_local_6e0);
          auVar215 = vmovsldup_avx(_local_6e0);
          local_6e0._0_4_ = auVar159._0_4_ * auVar215._0_4_ + auVar206._0_4_ * auVar111._0_4_;
          local_6e0._4_4_ = auVar159._4_4_ * auVar215._4_4_ + auVar206._4_4_ * auVar111._4_4_;
          fStack_6d8 = auVar159._8_4_ * auVar215._8_4_ + auVar206._8_4_ * auVar111._8_4_;
          fStack_6d4 = auVar159._12_4_ * auVar215._12_4_ + auVar206._12_4_ * auVar111._12_4_;
          auVar85 = vmovshdup_avx(_local_6e0);
          auVar111 = vsubps_avx(auVar182,auVar135);
          auVar211._0_4_ = auVar111._0_4_ * 3.0;
          auVar211._4_4_ = auVar111._4_4_ * 3.0;
          auVar211._8_4_ = auVar111._8_4_ * 3.0;
          auVar211._12_4_ = auVar111._12_4_ * 3.0;
          auVar111 = vsubps_avx(auVar243,auVar182);
          auVar230._0_4_ = auVar111._0_4_ * 3.0;
          auVar230._4_4_ = auVar111._4_4_ * 3.0;
          auVar230._8_4_ = auVar111._8_4_ * 3.0;
          auVar230._12_4_ = auVar111._12_4_ * 3.0;
          auVar111 = vsubps_avx(auVar257,auVar243);
          auVar276._0_4_ = auVar111._0_4_ * 3.0;
          auVar276._4_4_ = auVar111._4_4_ * 3.0;
          auVar276._8_4_ = auVar111._8_4_ * 3.0;
          auVar276._12_4_ = auVar111._12_4_ * 3.0;
          auVar206 = vminps_avx(auVar230,auVar276);
          auVar111 = vmaxps_avx(auVar230,auVar276);
          auVar206 = vminps_avx(auVar211,auVar206);
          auVar111 = vmaxps_avx(auVar211,auVar111);
          auVar215 = vshufpd_avx(auVar206,auVar206,3);
          auVar159 = vshufpd_avx(auVar111,auVar111,3);
          auVar206 = vminps_avx(auVar206,auVar215);
          auVar111 = vmaxps_avx(auVar111,auVar159);
          auVar215 = vshufps_avx(ZEXT416((uint)(1.0 / fVar220)),ZEXT416((uint)(1.0 / fVar220)),0);
          auVar212._0_4_ = auVar215._0_4_ * auVar206._0_4_;
          auVar212._4_4_ = auVar215._4_4_ * auVar206._4_4_;
          auVar212._8_4_ = auVar215._8_4_ * auVar206._8_4_;
          auVar212._12_4_ = auVar215._12_4_ * auVar206._12_4_;
          auVar231._0_4_ = auVar111._0_4_ * auVar215._0_4_;
          auVar231._4_4_ = auVar111._4_4_ * auVar215._4_4_;
          auVar231._8_4_ = auVar111._8_4_ * auVar215._8_4_;
          auVar231._12_4_ = auVar111._12_4_ * auVar215._12_4_;
          auVar88 = ZEXT416((uint)(1.0 / (auVar85._0_4_ - (float)local_6e0._0_4_)));
          auVar111 = vshufpd_avx(auVar135,auVar135,3);
          auVar206 = vshufpd_avx(auVar182,auVar182,3);
          auVar215 = vshufpd_avx(auVar243,auVar243,3);
          auVar159 = vshufpd_avx(auVar257,auVar257,3);
          auVar111 = vsubps_avx(auVar111,auVar135);
          auVar110 = vsubps_avx(auVar206,auVar182);
          auVar158 = vsubps_avx(auVar215,auVar243);
          auVar159 = vsubps_avx(auVar159,auVar257);
          auVar206 = vminps_avx(auVar111,auVar110);
          auVar111 = vmaxps_avx(auVar111,auVar110);
          auVar215 = vminps_avx(auVar158,auVar159);
          auVar215 = vminps_avx(auVar206,auVar215);
          auVar206 = vmaxps_avx(auVar158,auVar159);
          auVar111 = vmaxps_avx(auVar111,auVar206);
          auVar206 = vshufps_avx(auVar88,auVar88,0);
          auVar287._0_4_ = auVar206._0_4_ * auVar215._0_4_;
          auVar287._4_4_ = auVar206._4_4_ * auVar215._4_4_;
          auVar287._8_4_ = auVar206._8_4_ * auVar215._8_4_;
          auVar287._12_4_ = auVar206._12_4_ * auVar215._12_4_;
          auVar300._0_4_ = auVar206._0_4_ * auVar111._0_4_;
          auVar300._4_4_ = auVar206._4_4_ * auVar111._4_4_;
          auVar300._8_4_ = auVar206._8_4_ * auVar111._8_4_;
          auVar300._12_4_ = auVar206._12_4_ * auVar111._12_4_;
          auVar111 = vmovsldup_avx(_local_6e0);
          auVar244._4_12_ = auVar111._4_12_;
          auVar244._0_4_ = fVar221;
          auVar258._4_12_ = local_6e0._4_12_;
          auVar258._0_4_ = fVar219;
          auVar89._0_4_ = (fVar219 + fVar221) * 0.5;
          auVar89._4_4_ = ((float)local_6e0._4_4_ + auVar111._4_4_) * 0.5;
          auVar89._8_4_ = (fStack_6d8 + auVar111._8_4_) * 0.5;
          auVar89._12_4_ = (fStack_6d4 + auVar111._12_4_) * 0.5;
          auVar111 = vshufps_avx(auVar89,auVar89,0);
          fVar222 = auVar111._0_4_;
          fVar223 = auVar111._4_4_;
          fVar147 = auVar111._8_4_;
          fVar171 = auVar111._12_4_;
          local_580 = auVar7._0_4_;
          fStack_57c = auVar7._4_4_;
          fStack_578 = auVar7._8_4_;
          fStack_574 = auVar7._12_4_;
          auVar183._0_4_ = fVar222 * (float)local_330._0_4_ + local_580;
          auVar183._4_4_ = fVar223 * (float)local_330._4_4_ + fStack_57c;
          auVar183._8_4_ = fVar147 * fStack_328 + fStack_578;
          auVar183._12_4_ = fVar171 * fStack_324 + fStack_574;
          local_590 = auVar299._0_4_;
          fStack_58c = auVar299._4_4_;
          fStack_588 = auVar299._8_4_;
          fStack_584 = auVar299._12_4_;
          auVar277._0_4_ = fVar222 * (float)local_340._0_4_ + local_590;
          auVar277._4_4_ = fVar223 * (float)local_340._4_4_ + fStack_58c;
          auVar277._8_4_ = fVar147 * fStack_338 + fStack_588;
          auVar277._12_4_ = fVar171 * fStack_334 + fStack_584;
          local_5a0 = auVar8._0_4_;
          fStack_59c = auVar8._4_4_;
          fStack_598 = auVar8._8_4_;
          fStack_594 = auVar8._12_4_;
          auVar311._0_4_ = fVar222 * (float)local_350._0_4_ + local_5a0;
          auVar311._4_4_ = fVar223 * (float)local_350._4_4_ + fStack_59c;
          auVar311._8_4_ = fVar147 * fStack_348 + fStack_598;
          auVar311._12_4_ = fVar171 * fStack_344 + fStack_594;
          auVar111 = vsubps_avx(auVar277,auVar183);
          auVar184._0_4_ = auVar111._0_4_ * fVar222 + auVar183._0_4_;
          auVar184._4_4_ = auVar111._4_4_ * fVar223 + auVar183._4_4_;
          auVar184._8_4_ = auVar111._8_4_ * fVar147 + auVar183._8_4_;
          auVar184._12_4_ = auVar111._12_4_ * fVar171 + auVar183._12_4_;
          auVar111 = vsubps_avx(auVar311,auVar277);
          auVar278._0_4_ = auVar277._0_4_ + auVar111._0_4_ * fVar222;
          auVar278._4_4_ = auVar277._4_4_ + auVar111._4_4_ * fVar223;
          auVar278._8_4_ = auVar277._8_4_ + auVar111._8_4_ * fVar147;
          auVar278._12_4_ = auVar277._12_4_ + auVar111._12_4_ * fVar171;
          auVar111 = vsubps_avx(auVar278,auVar184);
          fVar222 = auVar184._0_4_ + auVar111._0_4_ * fVar222;
          fVar223 = auVar184._4_4_ + auVar111._4_4_ * fVar223;
          auVar136._0_8_ = CONCAT44(fVar223,fVar222);
          auVar136._8_4_ = auVar184._8_4_ + auVar111._8_4_ * fVar147;
          auVar136._12_4_ = auVar184._12_4_ + auVar111._12_4_ * fVar171;
          fVar147 = auVar111._0_4_ * 3.0;
          fVar171 = auVar111._4_4_ * 3.0;
          auVar185._0_8_ = CONCAT44(fVar171,fVar147);
          auVar185._8_4_ = auVar111._8_4_ * 3.0;
          auVar185._12_4_ = auVar111._12_4_ * 3.0;
          auVar279._8_8_ = auVar136._0_8_;
          auVar279._0_8_ = auVar136._0_8_;
          auVar111 = vshufpd_avx(auVar136,auVar136,3);
          auVar206 = vshufps_avx(auVar89,auVar89,0x55);
          auVar158 = vsubps_avx(auVar111,auVar279);
          auVar280._0_4_ = auVar206._0_4_ * auVar158._0_4_ + fVar222;
          auVar280._4_4_ = auVar206._4_4_ * auVar158._4_4_ + fVar223;
          auVar280._8_4_ = auVar206._8_4_ * auVar158._8_4_ + fVar222;
          auVar280._12_4_ = auVar206._12_4_ * auVar158._12_4_ + fVar223;
          auVar326._8_8_ = auVar185._0_8_;
          auVar326._0_8_ = auVar185._0_8_;
          auVar111 = vshufpd_avx(auVar185,auVar185,1);
          auVar111 = vsubps_avx(auVar111,auVar326);
          auVar186._0_4_ = fVar147 + auVar206._0_4_ * auVar111._0_4_;
          auVar186._4_4_ = fVar171 + auVar206._4_4_ * auVar111._4_4_;
          auVar186._8_4_ = fVar147 + auVar206._8_4_ * auVar111._8_4_;
          auVar186._12_4_ = fVar171 + auVar206._12_4_ * auVar111._12_4_;
          auVar206 = vmovshdup_avx(auVar186);
          auVar327._0_8_ = auVar206._0_8_ ^ 0x8000000080000000;
          auVar327._8_4_ = auVar206._8_4_ ^ 0x80000000;
          auVar327._12_4_ = auVar206._12_4_ ^ 0x80000000;
          auVar215 = vmovshdup_avx(auVar158);
          auVar111 = vunpcklps_avx(auVar215,auVar327);
          auVar159 = vshufps_avx(auVar111,auVar327,4);
          auVar137._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
          auVar137._8_4_ = -auVar158._8_4_;
          auVar137._12_4_ = -auVar158._12_4_;
          auVar111 = vmovlhps_avx(auVar137,auVar186);
          auVar110 = vshufps_avx(auVar111,auVar186,8);
          auVar111 = ZEXT416((uint)(auVar215._0_4_ * auVar186._0_4_ -
                                   auVar206._0_4_ * auVar158._0_4_));
          auVar206 = vshufps_avx(auVar111,auVar111,0);
          auVar111 = vdivps_avx(auVar159,auVar206);
          auVar206 = vdivps_avx(auVar110,auVar206);
          auVar110 = vinsertps_avx(auVar212,auVar287,0x1c);
          auVar158 = vinsertps_avx(auVar231,auVar300,0x1c);
          auVar88 = vinsertps_avx(auVar287,auVar212,0x4c);
          auVar133 = vinsertps_avx(auVar300,auVar231,0x4c);
          auVar215 = vmovsldup_avx(auVar111);
          auVar301._0_4_ = auVar215._0_4_ * auVar110._0_4_;
          auVar301._4_4_ = auVar215._4_4_ * auVar110._4_4_;
          auVar301._8_4_ = auVar215._8_4_ * auVar110._8_4_;
          auVar301._12_4_ = auVar215._12_4_ * auVar110._12_4_;
          auVar288._0_4_ = auVar215._0_4_ * auVar158._0_4_;
          auVar288._4_4_ = auVar215._4_4_ * auVar158._4_4_;
          auVar288._8_4_ = auVar215._8_4_ * auVar158._8_4_;
          auVar288._12_4_ = auVar215._12_4_ * auVar158._12_4_;
          auVar159 = vminps_avx(auVar301,auVar288);
          auVar215 = vmaxps_avx(auVar288,auVar301);
          auVar271 = vmovsldup_avx(auVar206);
          auVar350._0_4_ = auVar271._0_4_ * auVar88._0_4_;
          auVar350._4_4_ = auVar271._4_4_ * auVar88._4_4_;
          auVar350._8_4_ = auVar271._8_4_ * auVar88._8_4_;
          auVar350._12_4_ = auVar271._12_4_ * auVar88._12_4_;
          auVar289._0_4_ = auVar271._0_4_ * auVar133._0_4_;
          auVar289._4_4_ = auVar271._4_4_ * auVar133._4_4_;
          auVar289._8_4_ = auVar271._8_4_ * auVar133._8_4_;
          auVar289._12_4_ = auVar271._12_4_ * auVar133._12_4_;
          auVar271 = vminps_avx(auVar350,auVar289);
          auVar114._0_4_ = auVar159._0_4_ + auVar271._0_4_;
          auVar114._4_4_ = auVar159._4_4_ + auVar271._4_4_;
          auVar114._8_4_ = auVar159._8_4_ + auVar271._8_4_;
          auVar114._12_4_ = auVar159._12_4_ + auVar271._12_4_;
          auVar159 = vmaxps_avx(auVar289,auVar350);
          auVar271 = vsubps_avx(auVar244,auVar89);
          auVar101 = vsubps_avx(auVar258,auVar89);
          auVar259._0_4_ = auVar215._0_4_ + auVar159._0_4_;
          auVar259._4_4_ = auVar215._4_4_ + auVar159._4_4_;
          auVar259._8_4_ = auVar215._8_4_ + auVar159._8_4_;
          auVar259._12_4_ = auVar215._12_4_ + auVar159._12_4_;
          auVar302._8_8_ = 0x3f800000;
          auVar302._0_8_ = 0x3f800000;
          auVar215 = vsubps_avx(auVar302,auVar259);
          auVar159 = vsubps_avx(auVar302,auVar114);
          fVar174 = auVar271._0_4_;
          auVar303._0_4_ = fVar174 * auVar215._0_4_;
          fVar193 = auVar271._4_4_;
          auVar303._4_4_ = fVar193 * auVar215._4_4_;
          fVar194 = auVar271._8_4_;
          auVar303._8_4_ = fVar194 * auVar215._8_4_;
          fVar195 = auVar271._12_4_;
          auVar303._12_4_ = fVar195 * auVar215._12_4_;
          fVar147 = auVar101._0_4_;
          auVar260._0_4_ = auVar215._0_4_ * fVar147;
          fVar171 = auVar101._4_4_;
          auVar260._4_4_ = auVar215._4_4_ * fVar171;
          fVar172 = auVar101._8_4_;
          auVar260._8_4_ = auVar215._8_4_ * fVar172;
          fVar173 = auVar101._12_4_;
          auVar260._12_4_ = auVar215._12_4_ * fVar173;
          auVar339._0_4_ = fVar174 * auVar159._0_4_;
          auVar339._4_4_ = fVar193 * auVar159._4_4_;
          auVar339._8_4_ = fVar194 * auVar159._8_4_;
          auVar339._12_4_ = fVar195 * auVar159._12_4_;
          auVar115._0_4_ = fVar147 * auVar159._0_4_;
          auVar115._4_4_ = fVar171 * auVar159._4_4_;
          auVar115._8_4_ = fVar172 * auVar159._8_4_;
          auVar115._12_4_ = fVar173 * auVar159._12_4_;
          auVar215 = vminps_avx(auVar303,auVar339);
          auVar159 = vminps_avx(auVar260,auVar115);
          auVar271 = vminps_avx(auVar215,auVar159);
          auVar215 = vmaxps_avx(auVar339,auVar303);
          auVar159 = vmaxps_avx(auVar115,auVar260);
          auVar101 = vshufps_avx(auVar89,auVar89,0x54);
          auVar159 = vmaxps_avx(auVar159,auVar215);
          auVar102 = vshufps_avx(auVar280,auVar280,0);
          auVar127 = vshufps_avx(auVar280,auVar280,0x55);
          auVar215 = vhaddps_avx(auVar271,auVar271);
          auVar159 = vhaddps_avx(auVar159,auVar159);
          auVar261._0_4_ = auVar102._0_4_ * auVar111._0_4_ + auVar127._0_4_ * auVar206._0_4_;
          auVar261._4_4_ = auVar102._4_4_ * auVar111._4_4_ + auVar127._4_4_ * auVar206._4_4_;
          auVar261._8_4_ = auVar102._8_4_ * auVar111._8_4_ + auVar127._8_4_ * auVar206._8_4_;
          auVar261._12_4_ = auVar102._12_4_ * auVar111._12_4_ + auVar127._12_4_ * auVar206._12_4_;
          auVar271 = vsubps_avx(auVar101,auVar261);
          fVar222 = auVar271._0_4_ + auVar215._0_4_;
          fVar223 = auVar271._0_4_ + auVar159._0_4_;
          auVar215 = vmaxss_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar222));
          auVar159 = vminss_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar219));
          if (auVar215._0_4_ <= auVar159._0_4_) {
            auVar215 = vmovshdup_avx(auVar111);
            auVar155._0_4_ = auVar110._0_4_ * auVar215._0_4_;
            auVar155._4_4_ = auVar110._4_4_ * auVar215._4_4_;
            auVar155._8_4_ = auVar110._8_4_ * auVar215._8_4_;
            auVar155._12_4_ = auVar110._12_4_ * auVar215._12_4_;
            auVar116._0_4_ = auVar158._0_4_ * auVar215._0_4_;
            auVar116._4_4_ = auVar158._4_4_ * auVar215._4_4_;
            auVar116._8_4_ = auVar158._8_4_ * auVar215._8_4_;
            auVar116._12_4_ = auVar158._12_4_ * auVar215._12_4_;
            auVar159 = vminps_avx(auVar155,auVar116);
            auVar215 = vmaxps_avx(auVar116,auVar155);
            auVar110 = vmovshdup_avx(auVar206);
            auVar213._0_4_ = auVar110._0_4_ * auVar88._0_4_;
            auVar213._4_4_ = auVar110._4_4_ * auVar88._4_4_;
            auVar213._8_4_ = auVar110._8_4_ * auVar88._8_4_;
            auVar213._12_4_ = auVar110._12_4_ * auVar88._12_4_;
            auVar156._0_4_ = auVar110._0_4_ * auVar133._0_4_;
            auVar156._4_4_ = auVar110._4_4_ * auVar133._4_4_;
            auVar156._8_4_ = auVar110._8_4_ * auVar133._8_4_;
            auVar156._12_4_ = auVar110._12_4_ * auVar133._12_4_;
            auVar110 = vminps_avx(auVar213,auVar156);
            auVar232._0_4_ = auVar159._0_4_ + auVar110._0_4_;
            auVar232._4_4_ = auVar159._4_4_ + auVar110._4_4_;
            auVar232._8_4_ = auVar159._8_4_ + auVar110._8_4_;
            auVar232._12_4_ = auVar159._12_4_ + auVar110._12_4_;
            auVar159 = vmaxps_avx(auVar156,auVar213);
            auVar117._0_4_ = auVar215._0_4_ + auVar159._0_4_;
            auVar117._4_4_ = auVar215._4_4_ + auVar159._4_4_;
            auVar117._8_4_ = auVar215._8_4_ + auVar159._8_4_;
            auVar117._12_4_ = auVar215._12_4_ + auVar159._12_4_;
            auVar215 = vsubps_avx(auVar153,auVar117);
            auVar159 = vsubps_avx(auVar153,auVar232);
            auVar214._0_4_ = fVar174 * auVar215._0_4_;
            auVar214._4_4_ = fVar193 * auVar215._4_4_;
            auVar214._8_4_ = fVar194 * auVar215._8_4_;
            auVar214._12_4_ = fVar195 * auVar215._12_4_;
            auVar233._0_4_ = fVar174 * auVar159._0_4_;
            auVar233._4_4_ = fVar193 * auVar159._4_4_;
            auVar233._8_4_ = fVar194 * auVar159._8_4_;
            auVar233._12_4_ = fVar195 * auVar159._12_4_;
            auVar118._0_4_ = fVar147 * auVar215._0_4_;
            auVar118._4_4_ = fVar171 * auVar215._4_4_;
            auVar118._8_4_ = fVar172 * auVar215._8_4_;
            auVar118._12_4_ = fVar173 * auVar215._12_4_;
            auVar157._0_4_ = fVar147 * auVar159._0_4_;
            auVar157._4_4_ = fVar171 * auVar159._4_4_;
            auVar157._8_4_ = fVar172 * auVar159._8_4_;
            auVar157._12_4_ = fVar173 * auVar159._12_4_;
            auVar215 = vminps_avx(auVar214,auVar233);
            auVar159 = vminps_avx(auVar118,auVar157);
            auVar215 = vminps_avx(auVar215,auVar159);
            auVar159 = vmaxps_avx(auVar233,auVar214);
            auVar110 = vmaxps_avx(auVar157,auVar118);
            auVar215 = vhaddps_avx(auVar215,auVar215);
            auVar159 = vmaxps_avx(auVar110,auVar159);
            auVar159 = vhaddps_avx(auVar159,auVar159);
            auVar110 = vmovshdup_avx(auVar271);
            auVar158 = ZEXT416((uint)(auVar110._0_4_ + auVar215._0_4_));
            auVar215 = vmaxss_avx(_local_6e0,auVar158);
            auVar110 = ZEXT416((uint)(auVar110._0_4_ + auVar159._0_4_));
            auVar159 = vminss_avx(auVar110,auVar85);
            if (auVar215._0_4_ <= auVar159._0_4_) {
              uVar76 = 0;
              auVar341 = ZEXT864(0) << 0x20;
              if (fVar222 <= fVar221) {
                auVar328._8_4_ = 0x7fffffff;
                auVar328._0_8_ = 0x7fffffff7fffffff;
                auVar328._12_4_ = 0x7fffffff;
              }
              else {
                auVar328._8_4_ = 0x7fffffff;
                auVar328._0_8_ = 0x7fffffff7fffffff;
                auVar328._12_4_ = 0x7fffffff;
                uVar76 = 0;
                if (fVar223 < fVar219) {
                  auVar215 = vcmpps_avx(auVar110,auVar85,1);
                  auVar159 = vcmpps_avx(_local_6e0,auVar158,1);
                  auVar215 = vandps_avx(auVar159,auVar215);
                  uVar76 = auVar215._0_4_;
                }
              }
              if (((uint)uVar80 < 4 && 0.001 <= fVar220) && (uVar76 & 1) == 0) {
                bVar60 = false;
              }
              else {
                lVar78 = 200;
                do {
                  fVar222 = auVar271._0_4_;
                  fVar220 = 1.0 - fVar222;
                  auVar215 = ZEXT416((uint)(fVar220 * fVar220 * fVar220));
                  auVar215 = vshufps_avx(auVar215,auVar215,0);
                  auVar159 = ZEXT416((uint)(fVar222 * 3.0 * fVar220 * fVar220));
                  auVar159 = vshufps_avx(auVar159,auVar159,0);
                  auVar110 = ZEXT416((uint)(fVar220 * fVar222 * fVar222 * 3.0));
                  auVar110 = vshufps_avx(auVar110,auVar110,0);
                  auVar158 = ZEXT416((uint)(fVar222 * fVar222 * fVar222));
                  auVar158 = vshufps_avx(auVar158,auVar158,0);
                  fVar220 = local_580 * auVar215._0_4_ +
                            local_590 * auVar159._0_4_ +
                            (float)local_490._0_4_ * auVar158._0_4_ + local_5a0 * auVar110._0_4_;
                  fVar222 = fStack_57c * auVar215._4_4_ +
                            fStack_58c * auVar159._4_4_ +
                            (float)local_490._4_4_ * auVar158._4_4_ + fStack_59c * auVar110._4_4_;
                  auVar119._0_8_ = CONCAT44(fVar222,fVar220);
                  auVar119._8_4_ =
                       fStack_578 * auVar215._8_4_ +
                       fStack_588 * auVar159._8_4_ +
                       fStack_488 * auVar158._8_4_ + fStack_598 * auVar110._8_4_;
                  auVar119._12_4_ =
                       fStack_574 * auVar215._12_4_ +
                       fStack_584 * auVar159._12_4_ +
                       fStack_484 * auVar158._12_4_ + fStack_594 * auVar110._12_4_;
                  auVar160._8_8_ = auVar119._0_8_;
                  auVar160._0_8_ = auVar119._0_8_;
                  auVar159 = vshufpd_avx(auVar119,auVar119,1);
                  auVar215 = vmovshdup_avx(auVar271);
                  auVar159 = vsubps_avx(auVar159,auVar160);
                  auVar120._0_4_ = auVar215._0_4_ * auVar159._0_4_ + fVar220;
                  auVar120._4_4_ = auVar215._4_4_ * auVar159._4_4_ + fVar222;
                  auVar120._8_4_ = auVar215._8_4_ * auVar159._8_4_ + fVar220;
                  auVar120._12_4_ = auVar215._12_4_ * auVar159._12_4_ + fVar222;
                  auVar215 = vshufps_avx(auVar120,auVar120,0);
                  auVar159 = vshufps_avx(auVar120,auVar120,0x55);
                  auVar161._0_4_ = auVar111._0_4_ * auVar215._0_4_ + auVar206._0_4_ * auVar159._0_4_
                  ;
                  auVar161._4_4_ = auVar111._4_4_ * auVar215._4_4_ + auVar206._4_4_ * auVar159._4_4_
                  ;
                  auVar161._8_4_ = auVar111._8_4_ * auVar215._8_4_ + auVar206._8_4_ * auVar159._8_4_
                  ;
                  auVar161._12_4_ =
                       auVar111._12_4_ * auVar215._12_4_ + auVar206._12_4_ * auVar159._12_4_;
                  auVar271 = vsubps_avx(auVar271,auVar161);
                  auVar215 = vandps_avx(auVar328,auVar120);
                  auVar159 = vshufps_avx(auVar215,auVar215,0xf5);
                  auVar215 = vmaxss_avx(auVar159,auVar215);
                  if (auVar215._0_4_ < fVar218) {
                    fVar220 = auVar271._0_4_;
                    if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                      auVar111 = vmovshdup_avx(auVar271);
                      fVar222 = auVar111._0_4_;
                      if ((0.0 <= fVar222) && (fVar222 <= 1.0)) {
                        auVar111 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar133 = vinsertps_avx(auVar111,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar111 = vdpps_avx(auVar133,local_360,0x7f);
                        auVar206 = vdpps_avx(auVar133,local_370,0x7f);
                        auVar215 = vdpps_avx(auVar133,local_3a0,0x7f);
                        auVar159 = vdpps_avx(auVar133,local_3b0,0x7f);
                        auVar110 = vdpps_avx(auVar133,local_3c0,0x7f);
                        auVar158 = vdpps_avx(auVar133,local_3d0,0x7f);
                        fVar173 = 1.0 - fVar222;
                        auVar88 = vdpps_avx(auVar133,local_380,0x7f);
                        auVar133 = vdpps_avx(auVar133,local_390,0x7f);
                        fVar174 = 1.0 - fVar220;
                        fVar223 = auVar271._4_4_;
                        fVar147 = auVar271._8_4_;
                        fVar171 = auVar271._12_4_;
                        fVar172 = fVar174 * fVar220 * fVar220 * 3.0;
                        auVar216._0_4_ = fVar220 * fVar220 * fVar220;
                        auVar216._4_4_ = fVar223 * fVar223 * fVar223;
                        auVar216._8_4_ = fVar147 * fVar147 * fVar147;
                        auVar216._12_4_ = fVar171 * fVar171 * fVar171;
                        fVar223 = fVar220 * 3.0 * fVar174 * fVar174;
                        fVar147 = fVar174 * fVar174 * fVar174;
                        fVar220 = (fVar173 * auVar111._0_4_ + fVar222 * auVar215._0_4_) * fVar147 +
                                  (fVar173 * auVar206._0_4_ + fVar222 * auVar159._0_4_) * fVar223 +
                                  fVar172 * (fVar173 * auVar88._0_4_ + fVar222 * auVar110._0_4_) +
                                  auVar216._0_4_ *
                                  (auVar158._0_4_ * fVar222 + fVar173 * auVar133._0_4_);
                        if ((fVar198 <= fVar220) &&
                           (fVar222 = *(float *)(ray + k * 4 + 0x100), fVar220 <= fVar222)) {
                          pGVar10 = (context->scene->geometries).items[uVar82].ptr;
                          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar84 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar84 = true,
                                  pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar271,auVar271,0x55);
                            auVar262._8_4_ = 0x3f800000;
                            auVar262._0_8_ = &DAT_3f8000003f800000;
                            auVar262._12_4_ = 0x3f800000;
                            auVar111 = vsubps_avx(auVar262,local_f0);
                            fVar171 = local_f0._0_4_;
                            fVar173 = local_f0._4_4_;
                            fVar193 = local_f0._8_4_;
                            fVar194 = local_f0._12_4_;
                            fVar195 = auVar111._0_4_;
                            fVar196 = auVar111._4_4_;
                            fVar197 = auVar111._8_4_;
                            fVar294 = auVar111._12_4_;
                            auVar281._0_4_ =
                                 fVar171 * (float)local_4b0._0_4_ + fVar195 * (float)local_4a0._0_4_
                            ;
                            auVar281._4_4_ =
                                 fVar173 * (float)local_4b0._4_4_ + fVar196 * (float)local_4a0._4_4_
                            ;
                            auVar281._8_4_ = fVar193 * fStack_4a8 + fVar197 * fStack_498;
                            auVar281._12_4_ = fVar194 * fStack_4a4 + fVar294 * fStack_494;
                            auVar290._0_4_ =
                                 fVar171 * (float)local_500._0_4_ + fVar195 * (float)local_4e0._0_4_
                            ;
                            auVar290._4_4_ =
                                 fVar173 * (float)local_500._4_4_ + fVar196 * (float)local_4e0._4_4_
                            ;
                            auVar290._8_4_ = fVar193 * fStack_4f8 + fVar197 * fStack_4d8;
                            auVar290._12_4_ = fVar194 * fStack_4f4 + fVar294 * fStack_4d4;
                            auVar304._0_4_ =
                                 fVar171 * (float)local_3e0._0_4_ + fVar195 * (float)local_4f0._0_4_
                            ;
                            auVar304._4_4_ =
                                 fVar173 * (float)local_3e0._4_4_ + fVar196 * (float)local_4f0._4_4_
                            ;
                            auVar304._8_4_ = fVar193 * fStack_3d8 + fVar197 * fStack_4e8;
                            auVar304._12_4_ = fVar194 * fStack_3d4 + fVar294 * fStack_4e4;
                            auVar263._0_4_ =
                                 fVar171 * (float)local_4d0._0_4_ + fVar195 * (float)local_4c0._0_4_
                            ;
                            auVar263._4_4_ =
                                 fVar173 * (float)local_4d0._4_4_ + fVar196 * (float)local_4c0._4_4_
                            ;
                            auVar263._8_4_ = fVar193 * fStack_4c8 + fVar197 * fStack_4b8;
                            auVar263._12_4_ = fVar194 * fStack_4c4 + fVar294 * fStack_4b4;
                            auVar159 = vsubps_avx(auVar290,auVar281);
                            auVar110 = vsubps_avx(auVar304,auVar290);
                            auVar158 = vsubps_avx(auVar263,auVar304);
                            local_110 = vshufps_avx(auVar271,auVar271,0);
                            fVar171 = local_110._0_4_;
                            fVar193 = local_110._4_4_;
                            fVar194 = local_110._8_4_;
                            fVar196 = local_110._12_4_;
                            auVar111 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                            fVar173 = auVar111._0_4_;
                            fVar174 = auVar111._4_4_;
                            fVar195 = auVar111._8_4_;
                            fVar197 = auVar111._12_4_;
                            auVar111 = vshufps_avx(auVar216,auVar216,0);
                            auVar206 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
                            auVar215 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                            auVar187._0_4_ =
                                 ((auVar110._0_4_ * fVar173 + auVar158._0_4_ * fVar171) * fVar171 +
                                 (auVar159._0_4_ * fVar173 + auVar110._0_4_ * fVar171) * fVar173) *
                                 3.0;
                            auVar187._4_4_ =
                                 ((auVar110._4_4_ * fVar174 + auVar158._4_4_ * fVar193) * fVar193 +
                                 (auVar159._4_4_ * fVar174 + auVar110._4_4_ * fVar193) * fVar174) *
                                 3.0;
                            auVar187._8_4_ =
                                 ((auVar110._8_4_ * fVar195 + auVar158._8_4_ * fVar194) * fVar194 +
                                 (auVar159._8_4_ * fVar195 + auVar110._8_4_ * fVar194) * fVar195) *
                                 3.0;
                            auVar187._12_4_ =
                                 ((auVar110._12_4_ * fVar197 + auVar158._12_4_ * fVar196) * fVar196
                                 + (auVar159._12_4_ * fVar197 + auVar110._12_4_ * fVar196) * fVar197
                                 ) * 3.0;
                            auVar159 = vshufps_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),0);
                            auVar138._0_4_ =
                                 auVar159._0_4_ * (float)local_3f0._0_4_ +
                                 auVar215._0_4_ * (float)local_400._0_4_ +
                                 auVar111._0_4_ * (float)local_420._0_4_ +
                                 auVar206._0_4_ * (float)local_410._0_4_;
                            auVar138._4_4_ =
                                 auVar159._4_4_ * (float)local_3f0._4_4_ +
                                 auVar215._4_4_ * (float)local_400._4_4_ +
                                 auVar111._4_4_ * (float)local_420._4_4_ +
                                 auVar206._4_4_ * (float)local_410._4_4_;
                            auVar138._8_4_ =
                                 auVar159._8_4_ * fStack_3e8 +
                                 auVar215._8_4_ * fStack_3f8 +
                                 auVar111._8_4_ * fStack_418 + auVar206._8_4_ * fStack_408;
                            auVar138._12_4_ =
                                 auVar159._12_4_ * fStack_3e4 +
                                 auVar215._12_4_ * fStack_3f4 +
                                 auVar111._12_4_ * fStack_414 + auVar206._12_4_ * fStack_404;
                            auVar111 = vshufps_avx(auVar187,auVar187,0xc9);
                            auVar162._0_4_ = auVar138._0_4_ * auVar111._0_4_;
                            auVar162._4_4_ = auVar138._4_4_ * auVar111._4_4_;
                            auVar162._8_4_ = auVar138._8_4_ * auVar111._8_4_;
                            auVar162._12_4_ = auVar138._12_4_ * auVar111._12_4_;
                            auVar111 = vshufps_avx(auVar138,auVar138,0xc9);
                            auVar139._0_4_ = auVar187._0_4_ * auVar111._0_4_;
                            auVar139._4_4_ = auVar187._4_4_ * auVar111._4_4_;
                            auVar139._8_4_ = auVar187._8_4_ * auVar111._8_4_;
                            auVar139._12_4_ = auVar187._12_4_ * auVar111._12_4_;
                            auVar111 = vsubps_avx(auVar139,auVar162);
                            local_170 = vshufps_avx(auVar111,auVar111,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar111,auVar111,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar111,auVar111,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            local_520 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar220;
                            local_530 = *(undefined8 *)(mm_lookupmask_ps + lVar83);
                            uStack_528 = *(undefined8 *)(mm_lookupmask_ps + lVar83 + 8);
                            local_540 = *(undefined8 *)(mm_lookupmask_ps + uVar77);
                            uStack_538 = *(undefined8 *)(mm_lookupmask_ps + uVar77 + 8);
                            local_470.valid = (int *)&local_540;
                            local_470.geometryUserPtr = pGVar10->userPtr;
                            local_470.context = context->user;
                            local_470.ray = (RTCRayN *)ray;
                            local_470.hit = local_180;
                            local_470.N = 8;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              local_440._0_8_ = context;
                              (*pGVar10->occlusionFilterN)(&local_470);
                              auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                              context = (RayQueryContext *)local_440._0_8_;
                            }
                            auVar70._8_8_ = uStack_538;
                            auVar70._0_8_ = local_540;
                            auVar111 = vpcmpeqd_avx(auVar341._0_16_,auVar70);
                            auVar72._8_8_ = uStack_528;
                            auVar72._0_8_ = local_530;
                            auVar206 = vpcmpeqd_avx(auVar341._0_16_,auVar72);
                            auVar98._16_16_ = auVar206;
                            auVar98._0_16_ = auVar111;
                            auVar90 = local_520 & ~auVar98;
                            if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar90 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar90 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar90 >> 0x7f,0) == '\0') &&
                                  (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar90 >> 0xbf,0) == '\0') &&
                                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar90[0x1f]) {
                              auVar99._0_4_ = auVar111._0_4_ ^ local_520._0_4_;
                              auVar99._4_4_ = auVar111._4_4_ ^ local_520._4_4_;
                              auVar99._8_4_ = auVar111._8_4_ ^ local_520._8_4_;
                              auVar99._12_4_ = auVar111._12_4_ ^ local_520._12_4_;
                              auVar99._16_4_ = auVar206._0_4_ ^ local_520._16_4_;
                              auVar99._20_4_ = auVar206._4_4_ ^ local_520._20_4_;
                              auVar99._24_4_ = auVar206._8_4_ ^ local_520._24_4_;
                              auVar99._28_4_ = auVar206._12_4_ ^ local_520._28_4_;
                            }
                            else {
                              p_Var13 = context->args->filter;
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var13)(&local_470);
                                auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar71._8_8_ = uStack_538;
                              auVar71._0_8_ = local_540;
                              auVar111 = vpcmpeqd_avx(auVar341._0_16_,auVar71);
                              auVar73._8_8_ = uStack_528;
                              auVar73._0_8_ = local_530;
                              auVar206 = vpcmpeqd_avx(auVar341._0_16_,auVar73);
                              auVar126._16_16_ = auVar206;
                              auVar126._0_16_ = auVar111;
                              auVar99._0_4_ = auVar111._0_4_ ^ local_520._0_4_;
                              auVar99._4_4_ = auVar111._4_4_ ^ local_520._4_4_;
                              auVar99._8_4_ = auVar111._8_4_ ^ local_520._8_4_;
                              auVar99._12_4_ = auVar111._12_4_ ^ local_520._12_4_;
                              auVar99._16_4_ = auVar206._0_4_ ^ local_520._16_4_;
                              auVar99._20_4_ = auVar206._4_4_ ^ local_520._20_4_;
                              auVar99._24_4_ = auVar206._8_4_ ^ local_520._24_4_;
                              auVar99._28_4_ = auVar206._12_4_ ^ local_520._28_4_;
                              auVar146._8_4_ = 0xff800000;
                              auVar146._0_8_ = 0xff800000ff800000;
                              auVar146._12_4_ = 0xff800000;
                              auVar146._16_4_ = 0xff800000;
                              auVar146._20_4_ = 0xff800000;
                              auVar146._24_4_ = 0xff800000;
                              auVar146._28_4_ = 0xff800000;
                              auVar90 = vblendvps_avx(auVar146,*(undefined1 (*) [32])
                                                                (local_470.ray + 0x100),auVar126);
                              *(undefined1 (*) [32])(local_470.ray + 0x100) = auVar90;
                            }
                            bVar68 = (auVar99 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar69 = (auVar99 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar67 = (auVar99 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar66 = SUB321(auVar99 >> 0x7f,0) != '\0';
                            bVar65 = (auVar99 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar64 = SUB321(auVar99 >> 0xbf,0) != '\0';
                            bVar61 = (auVar99 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar84 = auVar99[0x1f] < '\0';
                            if (((((((!bVar68 && !bVar69) && !bVar67) && !bVar66) && !bVar65) &&
                                 !bVar64) && !bVar61) && !bVar84) {
                              *(float *)(ray + k * 4 + 0x100) = fVar222;
                            }
                            bVar84 = ((((((bVar68 || bVar69) || bVar67) || bVar66) || bVar65) ||
                                      bVar64) || bVar61) || bVar84;
                          }
                          bVar74 = (bool)(bVar74 | bVar84);
                        }
                      }
                    }
                    break;
                  }
                  lVar78 = lVar78 + -1;
                } while (lVar78 != 0);
              }
              goto LAB_01144414;
            }
          }
          goto LAB_011447ba;
        }
      }
LAB_01144414:
    } while (bVar60);
    auVar111 = vinsertps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar219),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }